

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O2

void ConvertBGRAToRGB_SSE2(uint32_t *src,int num_pixels,uint8_t *dst)

{
  byte bVar1;
  byte bVar9;
  byte bVar17;
  byte bVar25;
  byte bVar33;
  byte bVar41;
  byte bVar49;
  byte bVar57;
  byte bVar65;
  byte bVar73;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  short sVar81;
  short sVar82;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar87;
  short sVar88;
  short sVar89;
  short sVar90;
  short sVar91;
  short sVar92;
  short sVar93;
  short sVar94;
  short sVar95;
  short sVar96;
  short sVar97;
  short sVar98;
  short sVar99;
  short sVar100;
  short sVar101;
  short sVar102;
  short sVar103;
  short sVar104;
  short sVar105;
  short sVar106;
  short sVar107;
  short sVar108;
  short sVar109;
  short sVar110;
  short sVar111;
  short sVar112;
  short sVar113;
  short sVar114;
  short sVar115;
  short sVar116;
  short sVar117;
  short sVar118;
  short sVar119;
  short sVar120;
  short sVar121;
  short sVar122;
  undefined4 uVar123;
  undefined1 auVar127 [12];
  undefined1 auVar128 [12];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  ushort uVar138;
  ushort uVar151;
  undefined4 uVar139;
  ushort uVar152;
  ushort uVar153;
  ushort uVar154;
  ushort uVar155;
  undefined1 auVar143 [12];
  undefined1 auVar144 [12];
  ushort uVar156;
  ushort uVar157;
  undefined4 uVar158;
  undefined1 auVar162 [12];
  undefined1 auVar163 [12];
  undefined1 auVar167 [16];
  ushort uVar171;
  undefined4 uVar172;
  ushort uVar184;
  ushort uVar185;
  ushort uVar186;
  ushort uVar187;
  undefined1 auVar176 [12];
  undefined1 auVar177 [12];
  ushort uVar188;
  ushort uVar189;
  ushort uVar190;
  undefined4 uVar191;
  undefined1 auVar195 [12];
  ushort uVar200;
  ushort uVar201;
  ushort uVar214;
  undefined4 uVar202;
  ushort uVar215;
  ushort uVar216;
  ushort uVar217;
  ushort uVar218;
  ushort uVar219;
  ushort uVar220;
  ushort uVar221;
  ushort uVar222;
  undefined1 auVar206 [12];
  undefined1 auVar207 [12];
  ushort uVar223;
  ushort uVar224;
  ushort uVar225;
  ushort uVar226;
  ushort uVar227;
  ushort uVar228;
  undefined4 uVar229;
  ushort uVar241;
  ushort uVar242;
  ushort uVar243;
  ushort uVar244;
  undefined1 auVar233 [12];
  undefined1 auVar234 [12];
  ushort uVar245;
  ushort uVar246;
  ushort uVar247;
  undefined4 uVar248;
  undefined1 auVar252 [12];
  undefined1 auVar255 [16];
  ushort uVar258;
  undefined4 uVar259;
  ushort uVar268;
  ushort uVar269;
  ushort uVar270;
  ushort uVar271;
  undefined1 auVar263 [12];
  ushort uVar272;
  ushort uVar273;
  ushort uVar274;
  undefined1 auVar275 [16];
  __m128i in4;
  __m128i in0;
  longlong local_b8;
  longlong lStack_b0;
  longlong local_a8;
  longlong lStack_a0;
  longlong local_98;
  longlong lStack_90;
  longlong local_88;
  longlong lStack_80;
  longlong local_78;
  longlong lStack_70;
  longlong local_68;
  longlong lStack_60;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  char cVar39;
  char cVar40;
  char cVar42;
  char cVar43;
  char cVar44;
  char cVar45;
  char cVar46;
  char cVar47;
  char cVar48;
  char cVar50;
  char cVar51;
  char cVar52;
  char cVar53;
  char cVar54;
  char cVar55;
  char cVar56;
  char cVar58;
  char cVar59;
  char cVar60;
  char cVar61;
  char cVar62;
  char cVar63;
  char cVar64;
  char cVar66;
  char cVar67;
  char cVar68;
  char cVar69;
  char cVar70;
  char cVar71;
  char cVar72;
  char cVar74;
  undefined6 uVar124;
  undefined8 uVar125;
  undefined1 auVar126 [12];
  undefined1 auVar129 [14];
  undefined1 auVar130 [14];
  undefined1 auVar131 [14];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined6 uVar140;
  undefined8 uVar141;
  undefined1 auVar142 [12];
  undefined1 auVar145 [14];
  undefined1 auVar146 [14];
  undefined1 auVar147 [14];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined6 uVar159;
  undefined8 uVar160;
  undefined1 auVar161 [12];
  undefined1 auVar164 [14];
  undefined1 auVar165 [14];
  undefined1 auVar166 [14];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined6 uVar173;
  undefined8 uVar174;
  undefined1 auVar175 [12];
  undefined1 auVar178 [14];
  undefined1 auVar179 [14];
  undefined1 auVar180 [14];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined6 uVar192;
  undefined8 uVar193;
  undefined1 auVar194 [12];
  undefined1 auVar196 [14];
  undefined1 auVar197 [14];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined6 uVar203;
  undefined8 uVar204;
  undefined1 auVar205 [12];
  undefined1 auVar208 [14];
  undefined1 auVar209 [14];
  undefined1 auVar210 [14];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined6 uVar230;
  undefined8 uVar231;
  undefined1 auVar232 [12];
  undefined1 auVar235 [14];
  undefined1 auVar236 [14];
  undefined1 auVar237 [14];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined6 uVar249;
  undefined8 uVar250;
  undefined1 auVar251 [12];
  undefined1 auVar253 [14];
  undefined1 auVar254 [14];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined6 uVar260;
  undefined8 uVar261;
  undefined1 auVar262 [12];
  undefined1 auVar264 [14];
  undefined1 auVar265 [14];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  
  for (; 0x1f < num_pixels; num_pixels = num_pixels + -0x20) {
    local_48 = *(longlong *)src;
    lStack_40 = *(longlong *)(src + 2);
    local_68 = *(longlong *)(src + 4);
    lStack_60 = *(longlong *)(src + 6);
    local_78 = *(longlong *)(src + 8);
    lStack_70 = *(longlong *)(src + 10);
    local_88 = *(longlong *)(src + 0xc);
    lStack_80 = *(longlong *)(src + 0xe);
    local_58 = *(longlong *)(src + 0x10);
    lStack_50 = *(longlong *)(src + 0x12);
    local_98 = *(longlong *)(src + 0x14);
    lStack_90 = *(longlong *)(src + 0x16);
    local_a8 = *(longlong *)(src + 0x18);
    lStack_a0 = *(longlong *)(src + 0x1a);
    local_b8 = *(longlong *)(src + 0x1c);
    lStack_b0 = *(longlong *)(src + 0x1e);
    VP8L32bToPlanar_SSE2
              ((__m128i *)&local_48,(__m128i *)&local_68,(__m128i *)&local_78,(__m128i *)&local_88);
    VP8L32bToPlanar_SSE2
              ((__m128i *)&local_58,(__m128i *)&local_98,(__m128i *)&local_a8,(__m128i *)&local_b8);
    auVar167._8_8_ = lStack_60;
    auVar167._0_8_ = local_68;
    auVar132._8_8_ = lStack_90;
    auVar132._0_8_ = local_98;
    auVar167 = auVar167 & _DAT_001a4ad0;
    auVar132 = auVar132 & _DAT_001a4ad0;
    sVar75 = auVar167._0_2_;
    sVar76 = auVar167._2_2_;
    bVar1 = (0 < sVar76) * (sVar76 < 0x100) * auVar167[2] - (0xff < sVar76);
    sVar76 = auVar167._4_2_;
    sVar83 = auVar167._6_2_;
    cVar2 = (0 < sVar83) * (sVar83 < 0x100) * auVar167[6] - (0xff < sVar83);
    uVar158 = CONCAT13(cVar2,CONCAT12((0 < sVar76) * (sVar76 < 0x100) * auVar167[4] -
                                      (0xff < sVar76),
                                      CONCAT11(bVar1,(0 < sVar75) * (sVar75 < 0x100) * auVar167[0] -
                                                     (0xff < sVar75))));
    sVar75 = auVar167._8_2_;
    sVar76 = auVar167._10_2_;
    cVar3 = (0 < sVar76) * (sVar76 < 0x100) * auVar167[10] - (0xff < sVar76);
    uVar159 = CONCAT15(cVar3,CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar167[8] -
                                      (0xff < sVar75),uVar158));
    sVar75 = auVar167._12_2_;
    sVar76 = auVar167._14_2_;
    cVar4 = (0 < sVar76) * (sVar76 < 0x100) * auVar167[0xe] - (0xff < sVar76);
    uVar160 = CONCAT17(cVar4,CONCAT16((0 < sVar75) * (sVar75 < 0x100) * auVar167[0xc] -
                                      (0xff < sVar75),uVar159));
    sVar75 = auVar132._0_2_;
    sVar76 = auVar132._2_2_;
    cVar5 = (0 < sVar76) * (sVar76 < 0x100) * auVar132[2] - (0xff < sVar76);
    auVar161._0_10_ =
         CONCAT19(cVar5,CONCAT18((0 < sVar75) * (sVar75 < 0x100) * auVar132[0] - (0xff < sVar75),
                                 uVar160));
    sVar75 = auVar132._4_2_;
    auVar161[10] = (0 < sVar75) * (sVar75 < 0x100) * auVar132[4] - (0xff < sVar75);
    sVar75 = auVar132._6_2_;
    cVar6 = (0 < sVar75) * (sVar75 < 0x100) * auVar132[6] - (0xff < sVar75);
    auVar161[0xb] = cVar6;
    sVar75 = auVar132._8_2_;
    auVar164[0xc] = (0 < sVar75) * (sVar75 < 0x100) * auVar132[8] - (0xff < sVar75);
    auVar164._0_12_ = auVar161;
    sVar75 = auVar132._10_2_;
    cVar7 = (0 < sVar75) * (sVar75 < 0x100) * auVar132[10] - (0xff < sVar75);
    auVar164[0xd] = cVar7;
    sVar75 = auVar132._12_2_;
    auVar168[0xe] = (0 < sVar75) * (sVar75 < 0x100) * auVar132[0xc] - (0xff < sVar75);
    auVar168._0_14_ = auVar164;
    sVar75 = auVar132._14_2_;
    cVar8 = (0 < sVar75) * (sVar75 < 0x100) * auVar132[0xe] - (0xff < sVar75);
    auVar168[0xf] = cVar8;
    auVar255._8_8_ = lStack_70;
    auVar255._0_8_ = local_78;
    auVar133._8_8_ = lStack_a0;
    auVar133._0_8_ = local_a8;
    auVar255 = auVar255 & _DAT_001a4ad0;
    auVar133 = auVar133 & _DAT_001a4ad0;
    sVar75 = auVar255._0_2_;
    sVar76 = auVar255._2_2_;
    bVar9 = (0 < sVar76) * (sVar76 < 0x100) * auVar255[2] - (0xff < sVar76);
    sVar76 = auVar255._4_2_;
    sVar83 = auVar255._6_2_;
    cVar10 = (0 < sVar83) * (sVar83 < 0x100) * auVar255[6] - (0xff < sVar83);
    uVar248 = CONCAT13(cVar10,CONCAT12((0 < sVar76) * (sVar76 < 0x100) * auVar255[4] -
                                       (0xff < sVar76),
                                       CONCAT11(bVar9,(0 < sVar75) * (sVar75 < 0x100) * auVar255[0]
                                                      - (0xff < sVar75))));
    sVar75 = auVar255._8_2_;
    sVar76 = auVar255._10_2_;
    cVar11 = (0 < sVar76) * (sVar76 < 0x100) * auVar255[10] - (0xff < sVar76);
    uVar249 = CONCAT15(cVar11,CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar255[8] -
                                       (0xff < sVar75),uVar248));
    sVar75 = auVar255._12_2_;
    sVar76 = auVar255._14_2_;
    cVar12 = (0 < sVar76) * (sVar76 < 0x100) * auVar255[0xe] - (0xff < sVar76);
    uVar250 = CONCAT17(cVar12,CONCAT16((0 < sVar75) * (sVar75 < 0x100) * auVar255[0xc] -
                                       (0xff < sVar75),uVar249));
    sVar75 = auVar133._0_2_;
    sVar76 = auVar133._2_2_;
    cVar13 = (0 < sVar76) * (sVar76 < 0x100) * auVar133[2] - (0xff < sVar76);
    auVar251._0_10_ =
         CONCAT19(cVar13,CONCAT18((0 < sVar75) * (sVar75 < 0x100) * auVar133[0] - (0xff < sVar75),
                                  uVar250));
    sVar75 = auVar133._4_2_;
    auVar251[10] = (0 < sVar75) * (sVar75 < 0x100) * auVar133[4] - (0xff < sVar75);
    sVar75 = auVar133._6_2_;
    cVar14 = (0 < sVar75) * (sVar75 < 0x100) * auVar133[6] - (0xff < sVar75);
    auVar251[0xb] = cVar14;
    sVar75 = auVar133._8_2_;
    auVar253[0xc] = (0 < sVar75) * (sVar75 < 0x100) * auVar133[8] - (0xff < sVar75);
    auVar253._0_12_ = auVar251;
    sVar75 = auVar133._10_2_;
    cVar15 = (0 < sVar75) * (sVar75 < 0x100) * auVar133[10] - (0xff < sVar75);
    auVar253[0xd] = cVar15;
    sVar75 = auVar133._12_2_;
    auVar256[0xe] = (0 < sVar75) * (sVar75 < 0x100) * auVar133[0xc] - (0xff < sVar75);
    auVar256._0_14_ = auVar253;
    sVar75 = auVar133._14_2_;
    cVar16 = (0 < sVar75) * (sVar75 < 0x100) * auVar133[0xe] - (0xff < sVar75);
    auVar256[0xf] = cVar16;
    auVar134._8_8_ = lStack_80;
    auVar134._0_8_ = local_88;
    auVar275._8_8_ = lStack_b0;
    auVar275._0_8_ = local_b8;
    auVar134 = auVar134 & _DAT_001a4ad0;
    auVar275 = auVar275 & _DAT_001a4ad0;
    sVar75 = auVar134._0_2_;
    sVar76 = auVar134._2_2_;
    bVar17 = (0 < sVar76) * (sVar76 < 0x100) * auVar134[2] - (0xff < sVar76);
    sVar76 = auVar134._4_2_;
    sVar83 = auVar134._6_2_;
    cVar18 = (0 < sVar83) * (sVar83 < 0x100) * auVar134[6] - (0xff < sVar83);
    uVar123 = CONCAT13(cVar18,CONCAT12((0 < sVar76) * (sVar76 < 0x100) * auVar134[4] -
                                       (0xff < sVar76),
                                       CONCAT11(bVar17,(0 < sVar75) * (sVar75 < 0x100) * auVar134[0]
                                                       - (0xff < sVar75))));
    sVar75 = auVar134._8_2_;
    sVar76 = auVar134._10_2_;
    cVar19 = (0 < sVar76) * (sVar76 < 0x100) * auVar134[10] - (0xff < sVar76);
    uVar124 = CONCAT15(cVar19,CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar134[8] -
                                       (0xff < sVar75),uVar123));
    sVar75 = auVar134._12_2_;
    sVar76 = auVar134._14_2_;
    cVar20 = (0 < sVar76) * (sVar76 < 0x100) * auVar134[0xe] - (0xff < sVar76);
    uVar125 = CONCAT17(cVar20,CONCAT16((0 < sVar75) * (sVar75 < 0x100) * auVar134[0xc] -
                                       (0xff < sVar75),uVar124));
    sVar75 = auVar275._0_2_;
    sVar76 = auVar275._2_2_;
    cVar21 = (0 < sVar76) * (sVar76 < 0x100) * auVar275[2] - (0xff < sVar76);
    auVar126._0_10_ =
         CONCAT19(cVar21,CONCAT18((0 < sVar75) * (sVar75 < 0x100) * auVar275[0] - (0xff < sVar75),
                                  uVar125));
    sVar75 = auVar275._4_2_;
    auVar126[10] = (0 < sVar75) * (sVar75 < 0x100) * auVar275[4] - (0xff < sVar75);
    sVar75 = auVar275._6_2_;
    cVar22 = (0 < sVar75) * (sVar75 < 0x100) * auVar275[6] - (0xff < sVar75);
    auVar126[0xb] = cVar22;
    sVar75 = auVar275._8_2_;
    auVar129[0xc] = (0 < sVar75) * (sVar75 < 0x100) * auVar275[8] - (0xff < sVar75);
    auVar129._0_12_ = auVar126;
    sVar75 = auVar275._10_2_;
    cVar23 = (0 < sVar75) * (sVar75 < 0x100) * auVar275[10] - (0xff < sVar75);
    auVar129[0xd] = cVar23;
    sVar75 = auVar275._12_2_;
    auVar135[0xe] = (0 < sVar75) * (sVar75 < 0x100) * auVar275[0xc] - (0xff < sVar75);
    auVar135._0_14_ = auVar129;
    sVar75 = auVar275._14_2_;
    cVar24 = (0 < sVar75) * (sVar75 < 0x100) * auVar275[0xe] - (0xff < sVar75);
    auVar135[0xf] = cVar24;
    uVar200 = (ushort)local_68 >> 8;
    uVar214 = (ushort)((ulong)local_68 >> 0x10) >> 8;
    uVar216 = (ushort)((ulong)local_68 >> 0x20) >> 8;
    uVar218 = (ushort)((ulong)local_68 >> 0x38);
    uVar220 = (ushort)lStack_60 >> 8;
    uVar222 = (ushort)((ulong)lStack_60 >> 0x10) >> 8;
    uVar224 = (ushort)((ulong)lStack_60 >> 0x20) >> 8;
    uVar226 = (ushort)((ulong)lStack_60 >> 0x38);
    uVar138 = (ushort)local_98 >> 8;
    uVar151 = (ushort)((ulong)local_98 >> 0x10) >> 8;
    uVar152 = (ushort)((ulong)local_98 >> 0x20) >> 8;
    uVar153 = (ushort)((ulong)local_98 >> 0x38);
    uVar154 = (ushort)lStack_90 >> 8;
    uVar155 = (ushort)((ulong)lStack_90 >> 0x10) >> 8;
    uVar156 = (ushort)((ulong)lStack_90 >> 0x20) >> 8;
    uVar157 = (ushort)((ulong)lStack_90 >> 0x38);
    bVar25 = (uVar214 != 0) * (uVar214 < 0x100) * (char)((ulong)local_68 >> 0x18) - (0xff < uVar214)
    ;
    cVar26 = (uVar218 != 0) * (uVar218 < 0x100) * (char)((ulong)local_68 >> 0x38) - (0xff < uVar218)
    ;
    uVar202 = CONCAT13(cVar26,CONCAT12((uVar216 != 0) * (uVar216 < 0x100) *
                                       (char)((ulong)local_68 >> 0x28) - (0xff < uVar216),
                                       CONCAT11(bVar25,(uVar200 != 0) * (uVar200 < 0x100) *
                                                       (char)((ulong)local_68 >> 8) -
                                                       (0xff < uVar200))));
    cVar27 = (uVar222 != 0) * (uVar222 < 0x100) * (char)((ulong)lStack_60 >> 0x18) -
             (0xff < uVar222);
    uVar203 = CONCAT15(cVar27,CONCAT14((uVar220 != 0) * (uVar220 < 0x100) *
                                       (char)((ulong)lStack_60 >> 8) - (0xff < uVar220),uVar202));
    cVar28 = (uVar226 != 0) * (uVar226 < 0x100) * (char)((ulong)lStack_60 >> 0x38) -
             (0xff < uVar226);
    uVar204 = CONCAT17(cVar28,CONCAT16((uVar224 != 0) * (uVar224 < 0x100) *
                                       (char)((ulong)lStack_60 >> 0x28) - (0xff < uVar224),uVar203))
    ;
    cVar29 = (uVar151 != 0) * (uVar151 < 0x100) * (char)((ulong)local_98 >> 0x18) - (0xff < uVar151)
    ;
    auVar205._0_10_ =
         CONCAT19(cVar29,CONCAT18((uVar138 != 0) * (uVar138 < 0x100) * (char)((ulong)local_98 >> 8)
                                  - (0xff < uVar138),uVar204));
    auVar205[10] = (uVar152 != 0) * (uVar152 < 0x100) * (char)((ulong)local_98 >> 0x28) -
                   (0xff < uVar152);
    cVar30 = (uVar153 != 0) * (uVar153 < 0x100) * (char)((ulong)local_98 >> 0x38) - (0xff < uVar153)
    ;
    auVar205[0xb] = cVar30;
    auVar208[0xc] =
         (uVar154 != 0) * (uVar154 < 0x100) * (char)((ulong)lStack_90 >> 8) - (0xff < uVar154);
    auVar208._0_12_ = auVar205;
    cVar31 = (uVar155 != 0) * (uVar155 < 0x100) * (char)((ulong)lStack_90 >> 0x18) -
             (0xff < uVar155);
    auVar208[0xd] = cVar31;
    auVar211[0xe] =
         (uVar156 != 0) * (uVar156 < 0x100) * (char)((ulong)lStack_90 >> 0x28) - (0xff < uVar156);
    auVar211._0_14_ = auVar208;
    cVar32 = (uVar157 != 0) * (uVar157 < 0x100) * (char)((ulong)lStack_90 >> 0x38) -
             (0xff < uVar157);
    auVar211[0xf] = cVar32;
    uVar138 = (ushort)local_78 >> 8;
    uVar151 = (ushort)((ulong)local_78 >> 0x10) >> 8;
    uVar152 = (ushort)((ulong)local_78 >> 0x20) >> 8;
    uVar153 = (ushort)((ulong)local_78 >> 0x38);
    uVar154 = (ushort)lStack_70 >> 8;
    uVar155 = (ushort)((ulong)lStack_70 >> 0x10) >> 8;
    uVar156 = (ushort)((ulong)lStack_70 >> 0x20) >> 8;
    uVar157 = (ushort)((ulong)lStack_70 >> 0x38);
    uVar200 = (ushort)local_a8 >> 8;
    uVar214 = (ushort)((ulong)local_a8 >> 0x10) >> 8;
    uVar216 = (ushort)((ulong)local_a8 >> 0x20) >> 8;
    uVar218 = (ushort)((ulong)local_a8 >> 0x38);
    uVar220 = (ushort)lStack_a0 >> 8;
    uVar222 = (ushort)((ulong)lStack_a0 >> 0x10) >> 8;
    uVar224 = (ushort)((ulong)lStack_a0 >> 0x20) >> 8;
    uVar226 = (ushort)((ulong)lStack_a0 >> 0x38);
    bVar33 = (uVar151 != 0) * (uVar151 < 0x100) * (char)((ulong)local_78 >> 0x18) - (0xff < uVar151)
    ;
    cVar34 = (uVar153 != 0) * (uVar153 < 0x100) * (char)((ulong)local_78 >> 0x38) - (0xff < uVar153)
    ;
    uVar172 = CONCAT13(cVar34,CONCAT12((uVar152 != 0) * (uVar152 < 0x100) *
                                       (char)((ulong)local_78 >> 0x28) - (0xff < uVar152),
                                       CONCAT11(bVar33,(uVar138 != 0) * (uVar138 < 0x100) *
                                                       (char)((ulong)local_78 >> 8) -
                                                       (0xff < uVar138))));
    cVar35 = (uVar155 != 0) * (uVar155 < 0x100) * (char)((ulong)lStack_70 >> 0x18) -
             (0xff < uVar155);
    uVar173 = CONCAT15(cVar35,CONCAT14((uVar154 != 0) * (uVar154 < 0x100) *
                                       (char)((ulong)lStack_70 >> 8) - (0xff < uVar154),uVar172));
    cVar36 = (uVar157 != 0) * (uVar157 < 0x100) * (char)((ulong)lStack_70 >> 0x38) -
             (0xff < uVar157);
    uVar174 = CONCAT17(cVar36,CONCAT16((uVar156 != 0) * (uVar156 < 0x100) *
                                       (char)((ulong)lStack_70 >> 0x28) - (0xff < uVar156),uVar173))
    ;
    cVar37 = (uVar214 != 0) * (uVar214 < 0x100) * (char)((ulong)local_a8 >> 0x18) - (0xff < uVar214)
    ;
    auVar175._0_10_ =
         CONCAT19(cVar37,CONCAT18((uVar200 != 0) * (uVar200 < 0x100) * (char)((ulong)local_a8 >> 8)
                                  - (0xff < uVar200),uVar174));
    auVar175[10] = (uVar216 != 0) * (uVar216 < 0x100) * (char)((ulong)local_a8 >> 0x28) -
                   (0xff < uVar216);
    cVar38 = (uVar218 != 0) * (uVar218 < 0x100) * (char)((ulong)local_a8 >> 0x38) - (0xff < uVar218)
    ;
    auVar175[0xb] = cVar38;
    auVar178[0xc] =
         (uVar220 != 0) * (uVar220 < 0x100) * (char)((ulong)lStack_a0 >> 8) - (0xff < uVar220);
    auVar178._0_12_ = auVar175;
    cVar39 = (uVar222 != 0) * (uVar222 < 0x100) * (char)((ulong)lStack_a0 >> 0x18) -
             (0xff < uVar222);
    auVar178[0xd] = cVar39;
    auVar181[0xe] =
         (uVar224 != 0) * (uVar224 < 0x100) * (char)((ulong)lStack_a0 >> 0x28) - (0xff < uVar224);
    auVar181._0_14_ = auVar178;
    cVar40 = (uVar226 != 0) * (uVar226 < 0x100) * (char)((ulong)lStack_a0 >> 0x38) -
             (0xff < uVar226);
    auVar181[0xf] = cVar40;
    uVar138 = (ushort)local_88 >> 8;
    uVar151 = (ushort)((ulong)local_88 >> 0x10) >> 8;
    uVar152 = (ushort)((ulong)local_88 >> 0x20) >> 8;
    uVar153 = (ushort)((ulong)local_88 >> 0x38);
    uVar154 = (ushort)lStack_80 >> 8;
    uVar155 = (ushort)((ulong)lStack_80 >> 0x10) >> 8;
    uVar156 = (ushort)((ulong)lStack_80 >> 0x20) >> 8;
    uVar157 = (ushort)((ulong)lStack_80 >> 0x38);
    uVar200 = (ushort)local_b8 >> 8;
    uVar214 = (ushort)((ulong)local_b8 >> 0x10) >> 8;
    uVar216 = (ushort)((ulong)local_b8 >> 0x20) >> 8;
    uVar218 = (ushort)((ulong)local_b8 >> 0x38);
    uVar220 = (ushort)lStack_b0 >> 8;
    uVar222 = (ushort)((ulong)lStack_b0 >> 0x10) >> 8;
    uVar224 = (ushort)((ulong)lStack_b0 >> 0x20) >> 8;
    uVar226 = (ushort)((ulong)lStack_b0 >> 0x38);
    bVar41 = (uVar151 != 0) * (uVar151 < 0x100) * (char)((ulong)local_88 >> 0x18) - (0xff < uVar151)
    ;
    cVar42 = (uVar153 != 0) * (uVar153 < 0x100) * (char)((ulong)local_88 >> 0x38) - (0xff < uVar153)
    ;
    uVar229 = CONCAT13(cVar42,CONCAT12((uVar152 != 0) * (uVar152 < 0x100) *
                                       (char)((ulong)local_88 >> 0x28) - (0xff < uVar152),
                                       CONCAT11(bVar41,(uVar138 != 0) * (uVar138 < 0x100) *
                                                       (char)((ulong)local_88 >> 8) -
                                                       (0xff < uVar138))));
    cVar43 = (uVar155 != 0) * (uVar155 < 0x100) * (char)((ulong)lStack_80 >> 0x18) -
             (0xff < uVar155);
    uVar230 = CONCAT15(cVar43,CONCAT14((uVar154 != 0) * (uVar154 < 0x100) *
                                       (char)((ulong)lStack_80 >> 8) - (0xff < uVar154),uVar229));
    cVar44 = (uVar157 != 0) * (uVar157 < 0x100) * (char)((ulong)lStack_80 >> 0x38) -
             (0xff < uVar157);
    uVar231 = CONCAT17(cVar44,CONCAT16((uVar156 != 0) * (uVar156 < 0x100) *
                                       (char)((ulong)lStack_80 >> 0x28) - (0xff < uVar156),uVar230))
    ;
    cVar45 = (uVar214 != 0) * (uVar214 < 0x100) * (char)((ulong)local_b8 >> 0x18) - (0xff < uVar214)
    ;
    auVar232._0_10_ =
         CONCAT19(cVar45,CONCAT18((uVar200 != 0) * (uVar200 < 0x100) * (char)((ulong)local_b8 >> 8)
                                  - (0xff < uVar200),uVar231));
    auVar232[10] = (uVar216 != 0) * (uVar216 < 0x100) * (char)((ulong)local_b8 >> 0x28) -
                   (0xff < uVar216);
    cVar46 = (uVar218 != 0) * (uVar218 < 0x100) * (char)((ulong)local_b8 >> 0x38) - (0xff < uVar218)
    ;
    auVar232[0xb] = cVar46;
    auVar235[0xc] =
         (uVar220 != 0) * (uVar220 < 0x100) * (char)((ulong)lStack_b0 >> 8) - (0xff < uVar220);
    auVar235._0_12_ = auVar232;
    cVar47 = (uVar222 != 0) * (uVar222 < 0x100) * (char)((ulong)lStack_b0 >> 0x18) -
             (0xff < uVar222);
    auVar235[0xd] = cVar47;
    auVar238[0xe] =
         (uVar224 != 0) * (uVar224 < 0x100) * (char)((ulong)lStack_b0 >> 0x28) - (0xff < uVar224);
    auVar238._0_14_ = auVar235;
    cVar48 = (uVar226 != 0) * (uVar226 < 0x100) * (char)((ulong)lStack_b0 >> 0x38) -
             (0xff < uVar226);
    auVar238[0xf] = cVar48;
    auVar133 = auVar168 & _DAT_001a4ad0;
    auVar275 = auVar256 & _DAT_001a4ad0;
    sVar75 = auVar133._0_2_;
    sVar76 = auVar133._2_2_;
    bVar49 = (0 < sVar76) * (sVar76 < 0x100) * auVar133[2] - (0xff < sVar76);
    sVar76 = auVar133._4_2_;
    sVar83 = auVar133._6_2_;
    cVar50 = (0 < sVar83) * (sVar83 < 0x100) * auVar133[6] - (0xff < sVar83);
    uVar191 = CONCAT13(cVar50,CONCAT12((0 < sVar76) * (sVar76 < 0x100) * auVar133[4] -
                                       (0xff < sVar76),
                                       CONCAT11(bVar49,(0 < sVar75) * (sVar75 < 0x100) * auVar133[0]
                                                       - (0xff < sVar75))));
    sVar75 = auVar133._8_2_;
    sVar76 = auVar133._10_2_;
    cVar51 = (0 < sVar76) * (sVar76 < 0x100) * auVar133[10] - (0xff < sVar76);
    uVar192 = CONCAT15(cVar51,CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar133[8] -
                                       (0xff < sVar75),uVar191));
    sVar75 = auVar133._12_2_;
    sVar76 = auVar133._14_2_;
    cVar52 = (0 < sVar76) * (sVar76 < 0x100) * auVar133[0xe] - (0xff < sVar76);
    uVar193 = CONCAT17(cVar52,CONCAT16((0 < sVar75) * (sVar75 < 0x100) * auVar133[0xc] -
                                       (0xff < sVar75),uVar192));
    sVar75 = auVar275._0_2_;
    sVar76 = auVar275._2_2_;
    cVar53 = (0 < sVar76) * (sVar76 < 0x100) * auVar275[2] - (0xff < sVar76);
    auVar194._0_10_ =
         CONCAT19(cVar53,CONCAT18((0 < sVar75) * (sVar75 < 0x100) * auVar275[0] - (0xff < sVar75),
                                  uVar193));
    sVar75 = auVar275._4_2_;
    auVar194[10] = (0 < sVar75) * (sVar75 < 0x100) * auVar275[4] - (0xff < sVar75);
    sVar75 = auVar275._6_2_;
    cVar54 = (0 < sVar75) * (sVar75 < 0x100) * auVar275[6] - (0xff < sVar75);
    auVar194[0xb] = cVar54;
    sVar75 = auVar275._8_2_;
    auVar196[0xc] = (0 < sVar75) * (sVar75 < 0x100) * auVar275[8] - (0xff < sVar75);
    auVar196._0_12_ = auVar194;
    sVar75 = auVar275._10_2_;
    cVar55 = (0 < sVar75) * (sVar75 < 0x100) * auVar275[10] - (0xff < sVar75);
    auVar196[0xd] = cVar55;
    sVar75 = auVar275._12_2_;
    auVar198[0xe] = (0 < sVar75) * (sVar75 < 0x100) * auVar275[0xc] - (0xff < sVar75);
    auVar198._0_14_ = auVar196;
    sVar75 = auVar275._14_2_;
    cVar56 = (0 < sVar75) * (sVar75 < 0x100) * auVar275[0xe] - (0xff < sVar75);
    auVar198[0xf] = cVar56;
    auVar133 = auVar135 & _DAT_001a4ad0;
    auVar275 = auVar211 & _DAT_001a4ad0;
    sVar75 = auVar133._0_2_;
    sVar76 = auVar133._2_2_;
    bVar57 = (0 < sVar76) * (sVar76 < 0x100) * auVar133[2] - (0xff < sVar76);
    sVar76 = auVar133._4_2_;
    sVar83 = auVar133._6_2_;
    cVar58 = (0 < sVar83) * (sVar83 < 0x100) * auVar133[6] - (0xff < sVar83);
    uVar259 = CONCAT13(cVar58,CONCAT12((0 < sVar76) * (sVar76 < 0x100) * auVar133[4] -
                                       (0xff < sVar76),
                                       CONCAT11(bVar57,(0 < sVar75) * (sVar75 < 0x100) * auVar133[0]
                                                       - (0xff < sVar75))));
    sVar75 = auVar133._8_2_;
    sVar76 = auVar133._10_2_;
    cVar59 = (0 < sVar76) * (sVar76 < 0x100) * auVar133[10] - (0xff < sVar76);
    uVar260 = CONCAT15(cVar59,CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar133[8] -
                                       (0xff < sVar75),uVar259));
    sVar75 = auVar133._12_2_;
    sVar76 = auVar133._14_2_;
    cVar60 = (0 < sVar76) * (sVar76 < 0x100) * auVar133[0xe] - (0xff < sVar76);
    uVar261 = CONCAT17(cVar60,CONCAT16((0 < sVar75) * (sVar75 < 0x100) * auVar133[0xc] -
                                       (0xff < sVar75),uVar260));
    sVar75 = auVar275._0_2_;
    sVar76 = auVar275._2_2_;
    cVar61 = (0 < sVar76) * (sVar76 < 0x100) * auVar275[2] - (0xff < sVar76);
    auVar262._0_10_ =
         CONCAT19(cVar61,CONCAT18((0 < sVar75) * (sVar75 < 0x100) * auVar275[0] - (0xff < sVar75),
                                  uVar261));
    sVar75 = auVar275._4_2_;
    auVar262[10] = (0 < sVar75) * (sVar75 < 0x100) * auVar275[4] - (0xff < sVar75);
    sVar75 = auVar275._6_2_;
    cVar62 = (0 < sVar75) * (sVar75 < 0x100) * auVar275[6] - (0xff < sVar75);
    auVar262[0xb] = cVar62;
    sVar75 = auVar275._8_2_;
    auVar264[0xc] = (0 < sVar75) * (sVar75 < 0x100) * auVar275[8] - (0xff < sVar75);
    auVar264._0_12_ = auVar262;
    sVar75 = auVar275._10_2_;
    cVar63 = (0 < sVar75) * (sVar75 < 0x100) * auVar275[10] - (0xff < sVar75);
    auVar264[0xd] = cVar63;
    sVar75 = auVar275._12_2_;
    auVar266[0xe] = (0 < sVar75) * (sVar75 < 0x100) * auVar275[0xc] - (0xff < sVar75);
    auVar266._0_14_ = auVar264;
    sVar75 = auVar275._14_2_;
    cVar64 = (0 < sVar75) * (sVar75 < 0x100) * auVar275[0xe] - (0xff < sVar75);
    auVar266[0xf] = cVar64;
    auVar275 = auVar181 & _DAT_001a4ad0;
    auVar133 = auVar238 & _DAT_001a4ad0;
    sVar75 = auVar275._0_2_;
    sVar76 = auVar275._2_2_;
    bVar65 = (0 < sVar76) * (sVar76 < 0x100) * auVar275[2] - (0xff < sVar76);
    sVar76 = auVar275._4_2_;
    sVar83 = auVar275._6_2_;
    cVar66 = (0 < sVar83) * (sVar83 < 0x100) * auVar275[6] - (0xff < sVar83);
    uVar139 = CONCAT13(cVar66,CONCAT12((0 < sVar76) * (sVar76 < 0x100) * auVar275[4] -
                                       (0xff < sVar76),
                                       CONCAT11(bVar65,(0 < sVar75) * (sVar75 < 0x100) * auVar275[0]
                                                       - (0xff < sVar75))));
    sVar75 = auVar275._8_2_;
    sVar76 = auVar275._10_2_;
    cVar67 = (0 < sVar76) * (sVar76 < 0x100) * auVar275[10] - (0xff < sVar76);
    uVar140 = CONCAT15(cVar67,CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar275[8] -
                                       (0xff < sVar75),uVar139));
    sVar75 = auVar275._12_2_;
    sVar76 = auVar275._14_2_;
    cVar68 = (0 < sVar76) * (sVar76 < 0x100) * auVar275[0xe] - (0xff < sVar76);
    uVar141 = CONCAT17(cVar68,CONCAT16((0 < sVar75) * (sVar75 < 0x100) * auVar275[0xc] -
                                       (0xff < sVar75),uVar140));
    sVar75 = auVar133._0_2_;
    sVar76 = auVar133._2_2_;
    cVar69 = (0 < sVar76) * (sVar76 < 0x100) * auVar133[2] - (0xff < sVar76);
    auVar142._0_10_ =
         CONCAT19(cVar69,CONCAT18((0 < sVar75) * (sVar75 < 0x100) * auVar133[0] - (0xff < sVar75),
                                  uVar141));
    sVar75 = auVar133._4_2_;
    auVar142[10] = (0 < sVar75) * (sVar75 < 0x100) * auVar133[4] - (0xff < sVar75);
    sVar75 = auVar133._6_2_;
    cVar70 = (0 < sVar75) * (sVar75 < 0x100) * auVar133[6] - (0xff < sVar75);
    auVar142[0xb] = cVar70;
    sVar75 = auVar133._8_2_;
    auVar145[0xc] = (0 < sVar75) * (sVar75 < 0x100) * auVar133[8] - (0xff < sVar75);
    auVar145._0_12_ = auVar142;
    sVar75 = auVar133._10_2_;
    cVar71 = (0 < sVar75) * (sVar75 < 0x100) * auVar133[10] - (0xff < sVar75);
    auVar145[0xd] = cVar71;
    sVar75 = auVar133._12_2_;
    auVar148[0xe] = (0 < sVar75) * (sVar75 < 0x100) * auVar133[0xc] - (0xff < sVar75);
    auVar148._0_14_ = auVar145;
    sVar75 = auVar133._14_2_;
    cVar72 = (0 < sVar75) * (sVar75 < 0x100) * auVar133[0xe] - (0xff < sVar75);
    auVar148[0xf] = cVar72;
    uVar138 = (ushort)bVar1;
    uVar151 = (ushort)((uint)uVar158 >> 0x18);
    uVar152 = (ushort)((uint6)uVar159 >> 0x28);
    uVar153 = (ushort)((ulong)uVar160 >> 0x38);
    uVar154 = (ushort)((unkuint10)auVar161._0_10_ >> 0x48);
    uVar155 = auVar161._10_2_ >> 8;
    uVar156 = auVar164._12_2_ >> 8;
    uVar157 = auVar168._14_2_ >> 8;
    uVar200 = (ushort)bVar9;
    uVar214 = (ushort)((uint)uVar248 >> 0x18);
    uVar216 = (ushort)((uint6)uVar249 >> 0x28);
    uVar218 = (ushort)((ulong)uVar250 >> 0x38);
    uVar220 = (ushort)((unkuint10)auVar251._0_10_ >> 0x48);
    uVar222 = auVar251._10_2_ >> 8;
    uVar224 = auVar253._12_2_ >> 8;
    uVar226 = auVar256._14_2_ >> 8;
    bVar73 = (uVar151 != 0) * (uVar151 < 0x100) * cVar2 - (0xff < uVar151);
    cVar74 = (uVar153 != 0) * (uVar153 < 0x100) * cVar4 - (0xff < uVar153);
    uVar158 = CONCAT13(cVar74,CONCAT12((uVar152 != 0) * (uVar152 < 0x100) * cVar3 - (0xff < uVar152)
                                       ,CONCAT11(bVar73,(uVar138 != 0) * (uVar138 < 0x100) * bVar1 -
                                                        (0xff < uVar138))));
    cVar2 = (uVar155 != 0) * (uVar155 < 0x100) * cVar6 - (0xff < uVar155);
    uVar159 = CONCAT15(cVar2,CONCAT14((uVar154 != 0) * (uVar154 < 0x100) * cVar5 - (0xff < uVar154),
                                      uVar158));
    cVar8 = (uVar157 != 0) * (uVar157 < 0x100) * cVar8 - (0xff < uVar157);
    uVar160 = CONCAT17(cVar8,CONCAT16((uVar156 != 0) * (uVar156 < 0x100) * cVar7 - (0xff < uVar156),
                                      uVar159));
    cVar3 = (uVar214 != 0) * (uVar214 < 0x100) * cVar10 - (0xff < uVar214);
    auVar162._0_10_ =
         CONCAT19(cVar3,CONCAT18((uVar200 != 0) * (uVar200 < 0x100) * bVar9 - (0xff < uVar200),
                                 uVar160));
    auVar162[10] = (uVar216 != 0) * (uVar216 < 0x100) * cVar11 - (0xff < uVar216);
    cVar6 = (uVar218 != 0) * (uVar218 < 0x100) * cVar12 - (0xff < uVar218);
    auVar162[0xb] = cVar6;
    auVar165[0xc] = (uVar220 != 0) * (uVar220 < 0x100) * cVar13 - (0xff < uVar220);
    auVar165._0_12_ = auVar162;
    cVar5 = (uVar222 != 0) * (uVar222 < 0x100) * cVar14 - (0xff < uVar222);
    auVar165[0xd] = cVar5;
    auVar169[0xe] = (uVar224 != 0) * (uVar224 < 0x100) * cVar15 - (0xff < uVar224);
    auVar169._0_14_ = auVar165;
    cVar4 = (uVar226 != 0) * (uVar226 < 0x100) * cVar16 - (0xff < uVar226);
    auVar169[0xf] = cVar4;
    uVar138 = (ushort)bVar17;
    uVar151 = (ushort)((uint)uVar123 >> 0x18);
    uVar152 = (ushort)((uint6)uVar124 >> 0x28);
    uVar153 = (ushort)((ulong)uVar125 >> 0x38);
    uVar154 = (ushort)((unkuint10)auVar126._0_10_ >> 0x48);
    uVar155 = auVar126._10_2_ >> 8;
    uVar156 = auVar129._12_2_ >> 8;
    uVar157 = auVar135._14_2_ >> 8;
    uVar200 = (ushort)bVar25;
    uVar214 = (ushort)((uint)uVar202 >> 0x18);
    uVar216 = (ushort)((uint6)uVar203 >> 0x28);
    uVar218 = (ushort)((ulong)uVar204 >> 0x38);
    uVar220 = (ushort)((unkuint10)auVar205._0_10_ >> 0x48);
    uVar222 = auVar205._10_2_ >> 8;
    uVar224 = auVar208._12_2_ >> 8;
    uVar226 = auVar211._14_2_ >> 8;
    bVar1 = (uVar151 != 0) * (uVar151 < 0x100) * cVar18 - (0xff < uVar151);
    cVar11 = (uVar153 != 0) * (uVar153 < 0x100) * cVar20 - (0xff < uVar153);
    uVar123 = CONCAT13(cVar11,CONCAT12((uVar152 != 0) * (uVar152 < 0x100) * cVar19 -
                                       (0xff < uVar152),
                                       CONCAT11(bVar1,(uVar138 != 0) * (uVar138 < 0x100) * bVar17 -
                                                      (0xff < uVar138))));
    cVar12 = (uVar155 != 0) * (uVar155 < 0x100) * cVar22 - (0xff < uVar155);
    uVar124 = CONCAT15(cVar12,CONCAT14((uVar154 != 0) * (uVar154 < 0x100) * cVar21 -
                                       (0xff < uVar154),uVar123));
    cVar13 = (uVar157 != 0) * (uVar157 < 0x100) * cVar24 - (0xff < uVar157);
    uVar125 = CONCAT17(cVar13,CONCAT16((uVar156 != 0) * (uVar156 < 0x100) * cVar23 -
                                       (0xff < uVar156),uVar124));
    cVar14 = (uVar214 != 0) * (uVar214 < 0x100) * cVar26 - (0xff < uVar214);
    auVar127._0_10_ =
         CONCAT19(cVar14,CONCAT18((uVar200 != 0) * (uVar200 < 0x100) * bVar25 - (0xff < uVar200),
                                  uVar125));
    auVar127[10] = (uVar216 != 0) * (uVar216 < 0x100) * cVar27 - (0xff < uVar216);
    cVar16 = (uVar218 != 0) * (uVar218 < 0x100) * cVar28 - (0xff < uVar218);
    auVar127[0xb] = cVar16;
    auVar130[0xc] = (uVar220 != 0) * (uVar220 < 0x100) * cVar29 - (0xff < uVar220);
    auVar130._0_12_ = auVar127;
    cVar15 = (uVar222 != 0) * (uVar222 < 0x100) * cVar30 - (0xff < uVar222);
    auVar130[0xd] = cVar15;
    auVar136[0xe] = (uVar224 != 0) * (uVar224 < 0x100) * cVar31 - (0xff < uVar224);
    auVar136._0_14_ = auVar130;
    cVar7 = (uVar226 != 0) * (uVar226 < 0x100) * cVar32 - (0xff < uVar226);
    auVar136[0xf] = cVar7;
    uVar138 = (ushort)bVar33;
    uVar151 = (ushort)((uint)uVar172 >> 0x18);
    uVar152 = (ushort)((uint6)uVar173 >> 0x28);
    uVar153 = (ushort)((ulong)uVar174 >> 0x38);
    uVar154 = (ushort)((unkuint10)auVar175._0_10_ >> 0x48);
    uVar155 = auVar175._10_2_ >> 8;
    uVar156 = auVar178._12_2_ >> 8;
    uVar157 = auVar181._14_2_ >> 8;
    uVar200 = (ushort)bVar41;
    uVar214 = (ushort)((uint)uVar229 >> 0x18);
    uVar216 = (ushort)((uint6)uVar230 >> 0x28);
    uVar218 = (ushort)((ulong)uVar231 >> 0x38);
    uVar220 = (ushort)((unkuint10)auVar232._0_10_ >> 0x48);
    uVar222 = auVar232._10_2_ >> 8;
    uVar224 = auVar235._12_2_ >> 8;
    uVar226 = auVar238._14_2_ >> 8;
    bVar9 = (uVar151 != 0) * (uVar151 < 0x100) * cVar34 - (0xff < uVar151);
    cVar10 = (uVar153 != 0) * (uVar153 < 0x100) * cVar36 - (0xff < uVar153);
    uVar172 = CONCAT13(cVar10,CONCAT12((uVar152 != 0) * (uVar152 < 0x100) * cVar35 -
                                       (0xff < uVar152),
                                       CONCAT11(bVar9,(uVar138 != 0) * (uVar138 < 0x100) * bVar33 -
                                                      (0xff < uVar138))));
    cVar18 = (uVar155 != 0) * (uVar155 < 0x100) * cVar38 - (0xff < uVar155);
    uVar173 = CONCAT15(cVar18,CONCAT14((uVar154 != 0) * (uVar154 < 0x100) * cVar37 -
                                       (0xff < uVar154),uVar172));
    cVar19 = (uVar157 != 0) * (uVar157 < 0x100) * cVar40 - (0xff < uVar157);
    uVar174 = CONCAT17(cVar19,CONCAT16((uVar156 != 0) * (uVar156 < 0x100) * cVar39 -
                                       (0xff < uVar156),uVar173));
    cVar20 = (uVar214 != 0) * (uVar214 < 0x100) * cVar42 - (0xff < uVar214);
    auVar176._0_10_ =
         CONCAT19(cVar20,CONCAT18((uVar200 != 0) * (uVar200 < 0x100) * bVar41 - (0xff < uVar200),
                                  uVar174));
    auVar176[10] = (uVar216 != 0) * (uVar216 < 0x100) * cVar43 - (0xff < uVar216);
    cVar21 = (uVar218 != 0) * (uVar218 < 0x100) * cVar44 - (0xff < uVar218);
    auVar176[0xb] = cVar21;
    auVar179[0xc] = (uVar220 != 0) * (uVar220 < 0x100) * cVar45 - (0xff < uVar220);
    auVar179._0_12_ = auVar176;
    cVar22 = (uVar222 != 0) * (uVar222 < 0x100) * cVar46 - (0xff < uVar222);
    auVar179[0xd] = cVar22;
    auVar182[0xe] = (uVar224 != 0) * (uVar224 < 0x100) * cVar47 - (0xff < uVar224);
    auVar182._0_14_ = auVar179;
    cVar23 = (uVar226 != 0) * (uVar226 < 0x100) * cVar48 - (0xff < uVar226);
    auVar182[0xf] = cVar23;
    auVar275 = auVar198 & _DAT_001a4ad0;
    auVar133 = auVar266 & _DAT_001a4ad0;
    sVar75 = auVar275._0_2_;
    sVar76 = auVar275._2_2_;
    bVar17 = (0 < sVar76) * (sVar76 < 0x100) * auVar275[2] - (0xff < sVar76);
    sVar76 = auVar275._4_2_;
    sVar83 = auVar275._6_2_;
    cVar31 = (0 < sVar83) * (sVar83 < 0x100) * auVar275[6] - (0xff < sVar83);
    uVar202 = CONCAT13(cVar31,CONCAT12((0 < sVar76) * (sVar76 < 0x100) * auVar275[4] -
                                       (0xff < sVar76),
                                       CONCAT11(bVar17,(0 < sVar75) * (sVar75 < 0x100) * auVar275[0]
                                                       - (0xff < sVar75))));
    sVar75 = auVar275._8_2_;
    sVar76 = auVar275._10_2_;
    cVar29 = (0 < sVar76) * (sVar76 < 0x100) * auVar275[10] - (0xff < sVar76);
    uVar203 = CONCAT15(cVar29,CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar275[8] -
                                       (0xff < sVar75),uVar202));
    sVar75 = auVar275._12_2_;
    sVar76 = auVar275._14_2_;
    cVar30 = (0 < sVar76) * (sVar76 < 0x100) * auVar275[0xe] - (0xff < sVar76);
    uVar204 = CONCAT17(cVar30,CONCAT16((0 < sVar75) * (sVar75 < 0x100) * auVar275[0xc] -
                                       (0xff < sVar75),uVar203));
    sVar75 = auVar133._0_2_;
    sVar76 = auVar133._2_2_;
    cVar27 = (0 < sVar76) * (sVar76 < 0x100) * auVar133[2] - (0xff < sVar76);
    auVar206._0_10_ =
         CONCAT19(cVar27,CONCAT18((0 < sVar75) * (sVar75 < 0x100) * auVar133[0] - (0xff < sVar75),
                                  uVar204));
    sVar75 = auVar133._4_2_;
    auVar206[10] = (0 < sVar75) * (sVar75 < 0x100) * auVar133[4] - (0xff < sVar75);
    sVar75 = auVar133._6_2_;
    cVar24 = (0 < sVar75) * (sVar75 < 0x100) * auVar133[6] - (0xff < sVar75);
    auVar206[0xb] = cVar24;
    sVar75 = auVar133._8_2_;
    auVar209[0xc] = (0 < sVar75) * (sVar75 < 0x100) * auVar133[8] - (0xff < sVar75);
    auVar209._0_12_ = auVar206;
    sVar75 = auVar133._10_2_;
    cVar28 = (0 < sVar75) * (sVar75 < 0x100) * auVar133[10] - (0xff < sVar75);
    auVar209[0xd] = cVar28;
    sVar75 = auVar133._12_2_;
    auVar212[0xe] = (0 < sVar75) * (sVar75 < 0x100) * auVar133[0xc] - (0xff < sVar75);
    auVar212._0_14_ = auVar209;
    sVar75 = auVar133._14_2_;
    cVar32 = (0 < sVar75) * (sVar75 < 0x100) * auVar133[0xe] - (0xff < sVar75);
    auVar212[0xf] = cVar32;
    auVar133 = auVar148 & _DAT_001a4ad0;
    auVar275 = auVar169 & _DAT_001a4ad0;
    sVar75 = auVar133._0_2_;
    sVar76 = auVar133._2_2_;
    bVar25 = (0 < sVar76) * (sVar76 < 0x100) * auVar133[2] - (0xff < sVar76);
    sVar76 = auVar133._4_2_;
    sVar83 = auVar133._6_2_;
    cVar26 = (0 < sVar83) * (sVar83 < 0x100) * auVar133[6] - (0xff < sVar83);
    uVar248 = CONCAT13(cVar26,CONCAT12((0 < sVar76) * (sVar76 < 0x100) * auVar133[4] -
                                       (0xff < sVar76),
                                       CONCAT11(bVar25,(0 < sVar75) * (sVar75 < 0x100) * auVar133[0]
                                                       - (0xff < sVar75))));
    sVar75 = auVar133._8_2_;
    sVar76 = auVar133._10_2_;
    cVar40 = (0 < sVar76) * (sVar76 < 0x100) * auVar133[10] - (0xff < sVar76);
    uVar249 = CONCAT15(cVar40,CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar133[8] -
                                       (0xff < sVar75),uVar248));
    sVar75 = auVar133._12_2_;
    sVar76 = auVar133._14_2_;
    cVar39 = (0 < sVar76) * (sVar76 < 0x100) * auVar133[0xe] - (0xff < sVar76);
    uVar250 = CONCAT17(cVar39,CONCAT16((0 < sVar75) * (sVar75 < 0x100) * auVar133[0xc] -
                                       (0xff < sVar75),uVar249));
    sVar75 = auVar275._0_2_;
    sVar76 = auVar275._2_2_;
    cVar38 = (0 < sVar76) * (sVar76 < 0x100) * auVar275[2] - (0xff < sVar76);
    auVar252._0_10_ =
         CONCAT19(cVar38,CONCAT18((0 < sVar75) * (sVar75 < 0x100) * auVar275[0] - (0xff < sVar75),
                                  uVar250));
    sVar75 = auVar275._4_2_;
    auVar252[10] = (0 < sVar75) * (sVar75 < 0x100) * auVar275[4] - (0xff < sVar75);
    sVar75 = auVar275._6_2_;
    cVar37 = (0 < sVar75) * (sVar75 < 0x100) * auVar275[6] - (0xff < sVar75);
    auVar252[0xb] = cVar37;
    sVar75 = auVar275._8_2_;
    auVar254[0xc] = (0 < sVar75) * (sVar75 < 0x100) * auVar275[8] - (0xff < sVar75);
    auVar254._0_12_ = auVar252;
    sVar75 = auVar275._10_2_;
    cVar36 = (0 < sVar75) * (sVar75 < 0x100) * auVar275[10] - (0xff < sVar75);
    auVar254[0xd] = cVar36;
    sVar75 = auVar275._12_2_;
    auVar257[0xe] = (0 < sVar75) * (sVar75 < 0x100) * auVar275[0xc] - (0xff < sVar75);
    auVar257._0_14_ = auVar254;
    sVar75 = auVar275._14_2_;
    cVar35 = (0 < sVar75) * (sVar75 < 0x100) * auVar275[0xe] - (0xff < sVar75);
    auVar257[0xf] = cVar35;
    auVar275 = auVar136 & _DAT_001a4ad0;
    auVar133 = auVar182 & _DAT_001a4ad0;
    sVar75 = auVar275._0_2_;
    sVar76 = auVar275._2_2_;
    bVar33 = (0 < sVar76) * (sVar76 < 0x100) * auVar275[2] - (0xff < sVar76);
    sVar76 = auVar275._4_2_;
    sVar83 = auVar275._6_2_;
    cVar34 = (0 < sVar83) * (sVar83 < 0x100) * auVar275[6] - (0xff < sVar83);
    uVar229 = CONCAT13(cVar34,CONCAT12((0 < sVar76) * (sVar76 < 0x100) * auVar275[4] -
                                       (0xff < sVar76),
                                       CONCAT11(bVar33,(0 < sVar75) * (sVar75 < 0x100) * auVar275[0]
                                                       - (0xff < sVar75))));
    sVar75 = auVar275._8_2_;
    sVar76 = auVar275._10_2_;
    cVar47 = (0 < sVar76) * (sVar76 < 0x100) * auVar275[10] - (0xff < sVar76);
    uVar230 = CONCAT15(cVar47,CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar275[8] -
                                       (0xff < sVar75),uVar229));
    sVar75 = auVar275._12_2_;
    sVar76 = auVar275._14_2_;
    cVar46 = (0 < sVar76) * (sVar76 < 0x100) * auVar275[0xe] - (0xff < sVar76);
    uVar231 = CONCAT17(cVar46,CONCAT16((0 < sVar75) * (sVar75 < 0x100) * auVar275[0xc] -
                                       (0xff < sVar75),uVar230));
    sVar75 = auVar133._0_2_;
    sVar76 = auVar133._2_2_;
    cVar45 = (0 < sVar76) * (sVar76 < 0x100) * auVar133[2] - (0xff < sVar76);
    auVar233._0_10_ =
         CONCAT19(cVar45,CONCAT18((0 < sVar75) * (sVar75 < 0x100) * auVar133[0] - (0xff < sVar75),
                                  uVar231));
    sVar75 = auVar133._4_2_;
    auVar233[10] = (0 < sVar75) * (sVar75 < 0x100) * auVar133[4] - (0xff < sVar75);
    sVar75 = auVar133._6_2_;
    cVar44 = (0 < sVar75) * (sVar75 < 0x100) * auVar133[6] - (0xff < sVar75);
    auVar233[0xb] = cVar44;
    sVar75 = auVar133._8_2_;
    auVar236[0xc] = (0 < sVar75) * (sVar75 < 0x100) * auVar133[8] - (0xff < sVar75);
    auVar236._0_12_ = auVar233;
    sVar75 = auVar133._10_2_;
    cVar43 = (0 < sVar75) * (sVar75 < 0x100) * auVar133[10] - (0xff < sVar75);
    auVar236[0xd] = cVar43;
    sVar75 = auVar133._12_2_;
    auVar239[0xe] = (0 < sVar75) * (sVar75 < 0x100) * auVar133[0xc] - (0xff < sVar75);
    auVar239._0_14_ = auVar236;
    sVar75 = auVar133._14_2_;
    cVar42 = (0 < sVar75) * (sVar75 < 0x100) * auVar133[0xe] - (0xff < sVar75);
    auVar239[0xf] = cVar42;
    uVar138 = (ushort)bVar49;
    uVar151 = (ushort)((uint)uVar191 >> 0x18);
    uVar152 = (ushort)((uint6)uVar192 >> 0x28);
    uVar153 = (ushort)((ulong)uVar193 >> 0x38);
    uVar154 = (ushort)((unkuint10)auVar194._0_10_ >> 0x48);
    uVar155 = auVar194._10_2_ >> 8;
    uVar156 = auVar196._12_2_ >> 8;
    uVar157 = auVar198._14_2_ >> 8;
    uVar200 = (ushort)bVar57;
    uVar214 = (ushort)((uint)uVar259 >> 0x18);
    uVar216 = (ushort)((uint6)uVar260 >> 0x28);
    uVar218 = (ushort)((ulong)uVar261 >> 0x38);
    uVar220 = (ushort)((unkuint10)auVar262._0_10_ >> 0x48);
    uVar222 = auVar262._10_2_ >> 8;
    uVar224 = auVar264._12_2_ >> 8;
    uVar226 = auVar266._14_2_ >> 8;
    bVar41 = (uVar151 != 0) * (uVar151 < 0x100) * cVar50 - (0xff < uVar151);
    cVar52 = (uVar153 != 0) * (uVar153 < 0x100) * cVar52 - (0xff < uVar153);
    uVar191 = CONCAT13(cVar52,CONCAT12((uVar152 != 0) * (uVar152 < 0x100) * cVar51 -
                                       (0xff < uVar152),
                                       CONCAT11(bVar41,(uVar138 != 0) * (uVar138 < 0x100) * bVar49 -
                                                       (0xff < uVar138))));
    cVar51 = (uVar155 != 0) * (uVar155 < 0x100) * cVar54 - (0xff < uVar155);
    uVar192 = CONCAT15(cVar51,CONCAT14((uVar154 != 0) * (uVar154 < 0x100) * cVar53 -
                                       (0xff < uVar154),uVar191));
    cVar53 = (uVar157 != 0) * (uVar157 < 0x100) * cVar56 - (0xff < uVar157);
    uVar193 = CONCAT17(cVar53,CONCAT16((uVar156 != 0) * (uVar156 < 0x100) * cVar55 -
                                       (0xff < uVar156),uVar192));
    cVar56 = (uVar214 != 0) * (uVar214 < 0x100) * cVar58 - (0xff < uVar214);
    auVar195._0_10_ =
         CONCAT19(cVar56,CONCAT18((uVar200 != 0) * (uVar200 < 0x100) * bVar57 - (0xff < uVar200),
                                  uVar193));
    auVar195[10] = (uVar216 != 0) * (uVar216 < 0x100) * cVar59 - (0xff < uVar216);
    cVar48 = (uVar218 != 0) * (uVar218 < 0x100) * cVar60 - (0xff < uVar218);
    auVar195[0xb] = cVar48;
    auVar197[0xc] = (uVar220 != 0) * (uVar220 < 0x100) * cVar61 - (0xff < uVar220);
    auVar197._0_12_ = auVar195;
    cVar55 = (uVar222 != 0) * (uVar222 < 0x100) * cVar62 - (0xff < uVar222);
    auVar197[0xd] = cVar55;
    auVar199[0xe] = (uVar224 != 0) * (uVar224 < 0x100) * cVar63 - (0xff < uVar224);
    auVar199._0_14_ = auVar197;
    cVar54 = (uVar226 != 0) * (uVar226 < 0x100) * cVar64 - (0xff < uVar226);
    auVar199[0xf] = cVar54;
    uVar138 = (ushort)bVar65;
    uVar151 = (ushort)((uint)uVar139 >> 0x18);
    uVar152 = (ushort)((uint6)uVar140 >> 0x28);
    uVar153 = (ushort)((ulong)uVar141 >> 0x38);
    uVar154 = (ushort)((unkuint10)auVar142._0_10_ >> 0x48);
    uVar155 = auVar142._10_2_ >> 8;
    uVar156 = auVar145._12_2_ >> 8;
    uVar157 = auVar148._14_2_ >> 8;
    uVar200 = (ushort)bVar73;
    uVar214 = (ushort)((uint)uVar158 >> 0x18);
    uVar216 = (ushort)((uint6)uVar159 >> 0x28);
    uVar218 = (ushort)((ulong)uVar160 >> 0x38);
    uVar220 = (ushort)((unkuint10)auVar162._0_10_ >> 0x48);
    uVar222 = auVar162._10_2_ >> 8;
    uVar224 = auVar165._12_2_ >> 8;
    uVar226 = auVar169._14_2_ >> 8;
    bVar49 = (uVar151 != 0) * (uVar151 < 0x100) * cVar66 - (0xff < uVar151);
    cVar50 = (uVar153 != 0) * (uVar153 < 0x100) * cVar68 - (0xff < uVar153);
    uVar139 = CONCAT13(cVar50,CONCAT12((uVar152 != 0) * (uVar152 < 0x100) * cVar67 -
                                       (0xff < uVar152),
                                       CONCAT11(bVar49,(uVar138 != 0) * (uVar138 < 0x100) * bVar65 -
                                                       (0xff < uVar138))));
    cVar58 = (uVar155 != 0) * (uVar155 < 0x100) * cVar70 - (0xff < uVar155);
    uVar140 = CONCAT15(cVar58,CONCAT14((uVar154 != 0) * (uVar154 < 0x100) * cVar69 -
                                       (0xff < uVar154),uVar139));
    cVar59 = (uVar157 != 0) * (uVar157 < 0x100) * cVar72 - (0xff < uVar157);
    uVar141 = CONCAT17(cVar59,CONCAT16((uVar156 != 0) * (uVar156 < 0x100) * cVar71 -
                                       (0xff < uVar156),uVar140));
    cVar60 = (uVar214 != 0) * (uVar214 < 0x100) * cVar74 - (0xff < uVar214);
    auVar143._0_10_ =
         CONCAT19(cVar60,CONCAT18((uVar200 != 0) * (uVar200 < 0x100) * bVar73 - (0xff < uVar200),
                                  uVar141));
    auVar143[10] = (uVar216 != 0) * (uVar216 < 0x100) * cVar2 - (0xff < uVar216);
    cVar8 = (uVar218 != 0) * (uVar218 < 0x100) * cVar8 - (0xff < uVar218);
    auVar143[0xb] = cVar8;
    auVar146[0xc] = (uVar220 != 0) * (uVar220 < 0x100) * cVar3 - (0xff < uVar220);
    auVar146._0_12_ = auVar143;
    cVar3 = (uVar222 != 0) * (uVar222 < 0x100) * cVar6 - (0xff < uVar222);
    auVar146[0xd] = cVar3;
    auVar149[0xe] = (uVar224 != 0) * (uVar224 < 0x100) * cVar5 - (0xff < uVar224);
    auVar149._0_14_ = auVar146;
    cVar4 = (uVar226 != 0) * (uVar226 < 0x100) * cVar4 - (0xff < uVar226);
    auVar149[0xf] = cVar4;
    uVar138 = (ushort)bVar1;
    uVar151 = (ushort)((uint)uVar123 >> 0x18);
    uVar152 = (ushort)((uint6)uVar124 >> 0x28);
    uVar153 = (ushort)((ulong)uVar125 >> 0x38);
    uVar154 = (ushort)((unkuint10)auVar127._0_10_ >> 0x48);
    uVar155 = auVar127._10_2_ >> 8;
    uVar156 = auVar130._12_2_ >> 8;
    uVar157 = auVar136._14_2_ >> 8;
    uVar200 = (ushort)bVar9;
    uVar214 = (ushort)((uint)uVar172 >> 0x18);
    uVar216 = (ushort)((uint6)uVar173 >> 0x28);
    uVar218 = (ushort)((ulong)uVar174 >> 0x38);
    uVar220 = (ushort)((unkuint10)auVar176._0_10_ >> 0x48);
    uVar222 = auVar176._10_2_ >> 8;
    uVar224 = auVar179._12_2_ >> 8;
    uVar226 = auVar182._14_2_ >> 8;
    bVar57 = (uVar151 != 0) * (uVar151 < 0x100) * cVar11 - (0xff < uVar151);
    cVar5 = (uVar153 != 0) * (uVar153 < 0x100) * cVar13 - (0xff < uVar153);
    uVar123 = CONCAT13(cVar5,CONCAT12((uVar152 != 0) * (uVar152 < 0x100) * cVar12 - (0xff < uVar152)
                                      ,CONCAT11(bVar57,(uVar138 != 0) * (uVar138 < 0x100) * bVar1 -
                                                       (0xff < uVar138))));
    cVar6 = (uVar155 != 0) * (uVar155 < 0x100) * cVar16 - (0xff < uVar155);
    uVar124 = CONCAT15(cVar6,CONCAT14((uVar154 != 0) * (uVar154 < 0x100) * cVar14 - (0xff < uVar154)
                                      ,uVar123));
    cVar7 = (uVar157 != 0) * (uVar157 < 0x100) * cVar7 - (0xff < uVar157);
    uVar125 = CONCAT17(cVar7,CONCAT16((uVar156 != 0) * (uVar156 < 0x100) * cVar15 - (0xff < uVar156)
                                      ,uVar124));
    cVar2 = (uVar214 != 0) * (uVar214 < 0x100) * cVar10 - (0xff < uVar214);
    auVar128._0_10_ =
         CONCAT19(cVar2,CONCAT18((uVar200 != 0) * (uVar200 < 0x100) * bVar9 - (0xff < uVar200),
                                 uVar125));
    auVar128[10] = (uVar216 != 0) * (uVar216 < 0x100) * cVar18 - (0xff < uVar216);
    cVar15 = (uVar218 != 0) * (uVar218 < 0x100) * cVar19 - (0xff < uVar218);
    auVar128[0xb] = cVar15;
    auVar131[0xc] = (uVar220 != 0) * (uVar220 < 0x100) * cVar20 - (0xff < uVar220);
    auVar131._0_12_ = auVar128;
    cVar16 = (uVar222 != 0) * (uVar222 < 0x100) * cVar21 - (0xff < uVar222);
    auVar131[0xd] = cVar16;
    auVar137[0xe] = (uVar224 != 0) * (uVar224 < 0x100) * cVar22 - (0xff < uVar224);
    auVar137._0_14_ = auVar131;
    cVar14 = (uVar226 != 0) * (uVar226 < 0x100) * cVar23 - (0xff < uVar226);
    auVar137[0xf] = cVar14;
    auVar275 = auVar212 & _DAT_001a4ad0;
    auVar133 = auVar257 & _DAT_001a4ad0;
    sVar75 = auVar275._0_2_;
    sVar76 = auVar275._2_2_;
    bVar1 = (0 < sVar76) * (sVar76 < 0x100) * auVar275[2] - (0xff < sVar76);
    sVar76 = auVar275._4_2_;
    sVar83 = auVar275._6_2_;
    cVar19 = (0 < sVar83) * (sVar83 < 0x100) * auVar275[6] - (0xff < sVar83);
    uVar158 = CONCAT13(cVar19,CONCAT12((0 < sVar76) * (sVar76 < 0x100) * auVar275[4] -
                                       (0xff < sVar76),
                                       CONCAT11(bVar1,(0 < sVar75) * (sVar75 < 0x100) * auVar275[0]
                                                      - (0xff < sVar75))));
    sVar75 = auVar275._8_2_;
    sVar76 = auVar275._10_2_;
    cVar18 = (0 < sVar76) * (sVar76 < 0x100) * auVar275[10] - (0xff < sVar76);
    uVar159 = CONCAT15(cVar18,CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar275[8] -
                                       (0xff < sVar75),uVar158));
    sVar75 = auVar275._12_2_;
    sVar76 = auVar275._14_2_;
    cVar10 = (0 < sVar76) * (sVar76 < 0x100) * auVar275[0xe] - (0xff < sVar76);
    uVar160 = CONCAT17(cVar10,CONCAT16((0 < sVar75) * (sVar75 < 0x100) * auVar275[0xc] -
                                       (0xff < sVar75),uVar159));
    sVar75 = auVar133._0_2_;
    sVar76 = auVar133._2_2_;
    cVar20 = (0 < sVar76) * (sVar76 < 0x100) * auVar133[2] - (0xff < sVar76);
    auVar163._0_10_ =
         CONCAT19(cVar20,CONCAT18((0 < sVar75) * (sVar75 < 0x100) * auVar133[0] - (0xff < sVar75),
                                  uVar160));
    sVar75 = auVar133._4_2_;
    auVar163[10] = (0 < sVar75) * (sVar75 < 0x100) * auVar133[4] - (0xff < sVar75);
    sVar75 = auVar133._6_2_;
    cVar13 = (0 < sVar75) * (sVar75 < 0x100) * auVar133[6] - (0xff < sVar75);
    auVar163[0xb] = cVar13;
    sVar75 = auVar133._8_2_;
    auVar166[0xc] = (0 < sVar75) * (sVar75 < 0x100) * auVar133[8] - (0xff < sVar75);
    auVar166._0_12_ = auVar163;
    sVar75 = auVar133._10_2_;
    cVar12 = (0 < sVar75) * (sVar75 < 0x100) * auVar133[10] - (0xff < sVar75);
    auVar166[0xd] = cVar12;
    sVar75 = auVar133._12_2_;
    auVar170[0xe] = (0 < sVar75) * (sVar75 < 0x100) * auVar133[0xc] - (0xff < sVar75);
    auVar170._0_14_ = auVar166;
    sVar75 = auVar133._14_2_;
    cVar11 = (0 < sVar75) * (sVar75 < 0x100) * auVar133[0xe] - (0xff < sVar75);
    auVar170[0xf] = cVar11;
    auVar133 = auVar239 & _DAT_001a4ad0;
    auVar275 = auVar199 & _DAT_001a4ad0;
    sVar75 = auVar133._0_2_;
    sVar76 = auVar133._2_2_;
    bVar9 = (0 < sVar76) * (sVar76 < 0x100) * auVar133[2] - (0xff < sVar76);
    sVar76 = auVar133._4_2_;
    sVar83 = auVar133._6_2_;
    cVar21 = (0 < sVar83) * (sVar83 < 0x100) * auVar133[6] - (0xff < sVar83);
    uVar259 = CONCAT13(cVar21,CONCAT12((0 < sVar76) * (sVar76 < 0x100) * auVar133[4] -
                                       (0xff < sVar76),
                                       CONCAT11(bVar9,(0 < sVar75) * (sVar75 < 0x100) * auVar133[0]
                                                      - (0xff < sVar75))));
    sVar75 = auVar133._8_2_;
    sVar76 = auVar133._10_2_;
    cVar22 = (0 < sVar76) * (sVar76 < 0x100) * auVar133[10] - (0xff < sVar76);
    uVar260 = CONCAT15(cVar22,CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar133[8] -
                                       (0xff < sVar75),uVar259));
    sVar75 = auVar133._12_2_;
    sVar76 = auVar133._14_2_;
    cVar23 = (0 < sVar76) * (sVar76 < 0x100) * auVar133[0xe] - (0xff < sVar76);
    uVar261 = CONCAT17(cVar23,CONCAT16((0 < sVar75) * (sVar75 < 0x100) * auVar133[0xc] -
                                       (0xff < sVar75),uVar260));
    sVar75 = auVar275._0_2_;
    sVar76 = auVar275._2_2_;
    cVar61 = (0 < sVar76) * (sVar76 < 0x100) * auVar275[2] - (0xff < sVar76);
    auVar263._0_10_ =
         CONCAT19(cVar61,CONCAT18((0 < sVar75) * (sVar75 < 0x100) * auVar275[0] - (0xff < sVar75),
                                  uVar261));
    sVar75 = auVar275._4_2_;
    auVar263[10] = (0 < sVar75) * (sVar75 < 0x100) * auVar275[4] - (0xff < sVar75);
    sVar75 = auVar275._6_2_;
    cVar62 = (0 < sVar75) * (sVar75 < 0x100) * auVar275[6] - (0xff < sVar75);
    auVar263[0xb] = cVar62;
    sVar75 = auVar275._8_2_;
    auVar265[0xc] = (0 < sVar75) * (sVar75 < 0x100) * auVar275[8] - (0xff < sVar75);
    auVar265._0_12_ = auVar263;
    sVar75 = auVar275._10_2_;
    cVar63 = (0 < sVar75) * (sVar75 < 0x100) * auVar275[10] - (0xff < sVar75);
    auVar265[0xd] = cVar63;
    sVar75 = auVar275._12_2_;
    auVar267[0xe] = (0 < sVar75) * (sVar75 < 0x100) * auVar275[0xc] - (0xff < sVar75);
    auVar267._0_14_ = auVar265;
    sVar75 = auVar275._14_2_;
    cVar64 = (0 < sVar75) * (sVar75 < 0x100) * auVar275[0xe] - (0xff < sVar75);
    auVar267[0xf] = cVar64;
    auVar275 = auVar149 & _DAT_001a4ad0;
    auVar133 = auVar137 & _DAT_001a4ad0;
    sVar75 = auVar275._0_2_;
    sVar76 = auVar275._2_2_;
    bVar65 = (0 < sVar76) * (sVar76 < 0x100) * auVar275[2] - (0xff < sVar76);
    sVar76 = auVar275._4_2_;
    sVar83 = auVar275._6_2_;
    cVar66 = (0 < sVar83) * (sVar83 < 0x100) * auVar275[6] - (0xff < sVar83);
    uVar172 = CONCAT13(cVar66,CONCAT12((0 < sVar76) * (sVar76 < 0x100) * auVar275[4] -
                                       (0xff < sVar76),
                                       CONCAT11(bVar65,(0 < sVar75) * (sVar75 < 0x100) * auVar275[0]
                                                       - (0xff < sVar75))));
    sVar75 = auVar275._8_2_;
    sVar76 = auVar275._10_2_;
    cVar67 = (0 < sVar76) * (sVar76 < 0x100) * auVar275[10] - (0xff < sVar76);
    uVar173 = CONCAT15(cVar67,CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar275[8] -
                                       (0xff < sVar75),uVar172));
    sVar75 = auVar275._12_2_;
    sVar76 = auVar275._14_2_;
    cVar68 = (0 < sVar76) * (sVar76 < 0x100) * auVar275[0xe] - (0xff < sVar76);
    uVar174 = CONCAT17(cVar68,CONCAT16((0 < sVar75) * (sVar75 < 0x100) * auVar275[0xc] -
                                       (0xff < sVar75),uVar173));
    sVar75 = auVar133._0_2_;
    sVar76 = auVar133._2_2_;
    cVar69 = (0 < sVar76) * (sVar76 < 0x100) * auVar133[2] - (0xff < sVar76);
    auVar177._0_10_ =
         CONCAT19(cVar69,CONCAT18((0 < sVar75) * (sVar75 < 0x100) * auVar133[0] - (0xff < sVar75),
                                  uVar174));
    sVar75 = auVar133._4_2_;
    auVar177[10] = (0 < sVar75) * (sVar75 < 0x100) * auVar133[4] - (0xff < sVar75);
    sVar75 = auVar133._6_2_;
    cVar70 = (0 < sVar75) * (sVar75 < 0x100) * auVar133[6] - (0xff < sVar75);
    auVar177[0xb] = cVar70;
    sVar75 = auVar133._8_2_;
    auVar180[0xc] = (0 < sVar75) * (sVar75 < 0x100) * auVar133[8] - (0xff < sVar75);
    auVar180._0_12_ = auVar177;
    sVar75 = auVar133._10_2_;
    cVar71 = (0 < sVar75) * (sVar75 < 0x100) * auVar133[10] - (0xff < sVar75);
    auVar180[0xd] = cVar71;
    sVar75 = auVar133._12_2_;
    auVar183[0xe] = (0 < sVar75) * (sVar75 < 0x100) * auVar133[0xc] - (0xff < sVar75);
    auVar183._0_14_ = auVar180;
    sVar75 = auVar133._14_2_;
    cVar72 = (0 < sVar75) * (sVar75 < 0x100) * auVar133[0xe] - (0xff < sVar75);
    auVar183[0xf] = cVar72;
    uVar138 = (ushort)bVar17;
    uVar151 = (ushort)((uint)uVar202 >> 0x18);
    uVar152 = (ushort)((uint6)uVar203 >> 0x28);
    uVar153 = (ushort)((ulong)uVar204 >> 0x38);
    uVar154 = (ushort)((unkuint10)auVar206._0_10_ >> 0x48);
    uVar155 = auVar206._10_2_ >> 8;
    uVar156 = auVar209._12_2_ >> 8;
    uVar157 = auVar212._14_2_ >> 8;
    uVar200 = (ushort)bVar25;
    uVar214 = (ushort)((uint)uVar248 >> 0x18);
    uVar216 = (ushort)((uint6)uVar249 >> 0x28);
    uVar218 = (ushort)((ulong)uVar250 >> 0x38);
    uVar220 = (ushort)((unkuint10)auVar252._0_10_ >> 0x48);
    uVar222 = auVar252._10_2_ >> 8;
    uVar224 = auVar254._12_2_ >> 8;
    uVar226 = auVar257._14_2_ >> 8;
    bVar73 = (uVar151 != 0) * (uVar151 < 0x100) * cVar31 - (0xff < uVar151);
    cVar74 = (uVar153 != 0) * (uVar153 < 0x100) * cVar30 - (0xff < uVar153);
    uVar202 = CONCAT13(cVar74,CONCAT12((uVar152 != 0) * (uVar152 < 0x100) * cVar29 -
                                       (0xff < uVar152),
                                       CONCAT11(bVar73,(uVar138 != 0) * (uVar138 < 0x100) * bVar17 -
                                                       (0xff < uVar138))));
    cVar30 = (uVar155 != 0) * (uVar155 < 0x100) * cVar24 - (0xff < uVar155);
    uVar203 = CONCAT15(cVar30,CONCAT14((uVar154 != 0) * (uVar154 < 0x100) * cVar27 -
                                       (0xff < uVar154),uVar202));
    cVar32 = (uVar157 != 0) * (uVar157 < 0x100) * cVar32 - (0xff < uVar157);
    uVar204 = CONCAT17(cVar32,CONCAT16((uVar156 != 0) * (uVar156 < 0x100) * cVar28 -
                                       (0xff < uVar156),uVar203));
    cVar29 = (uVar214 != 0) * (uVar214 < 0x100) * cVar26 - (0xff < uVar214);
    auVar207._0_10_ =
         CONCAT19(cVar29,CONCAT18((uVar200 != 0) * (uVar200 < 0x100) * bVar25 - (0xff < uVar200),
                                  uVar204));
    auVar207[10] = (uVar216 != 0) * (uVar216 < 0x100) * cVar40 - (0xff < uVar216);
    cVar31 = (uVar218 != 0) * (uVar218 < 0x100) * cVar39 - (0xff < uVar218);
    auVar207[0xb] = cVar31;
    auVar210[0xc] = (uVar220 != 0) * (uVar220 < 0x100) * cVar38 - (0xff < uVar220);
    auVar210._0_12_ = auVar207;
    cVar28 = (uVar222 != 0) * (uVar222 < 0x100) * cVar37 - (0xff < uVar222);
    auVar210[0xd] = cVar28;
    auVar213[0xe] = (uVar224 != 0) * (uVar224 < 0x100) * cVar36 - (0xff < uVar224);
    auVar213._0_14_ = auVar210;
    cVar24 = (uVar226 != 0) * (uVar226 < 0x100) * cVar35 - (0xff < uVar226);
    auVar213[0xf] = cVar24;
    uVar200 = (ushort)bVar33;
    uVar214 = (ushort)((uint)uVar229 >> 0x18);
    uVar216 = (ushort)((uint6)uVar230 >> 0x28);
    uVar218 = (ushort)((ulong)uVar231 >> 0x38);
    uVar220 = (ushort)((unkuint10)auVar233._0_10_ >> 0x48);
    uVar222 = auVar233._10_2_ >> 8;
    uVar224 = auVar236._12_2_ >> 8;
    uVar226 = auVar239._14_2_ >> 8;
    uVar138 = (ushort)bVar41;
    uVar151 = (ushort)((uint)uVar191 >> 0x18);
    uVar152 = (ushort)((uint6)uVar192 >> 0x28);
    uVar153 = (ushort)((ulong)uVar193 >> 0x38);
    uVar154 = (ushort)((unkuint10)auVar195._0_10_ >> 0x48);
    uVar155 = auVar195._10_2_ >> 8;
    uVar156 = auVar197._12_2_ >> 8;
    uVar157 = auVar199._14_2_ >> 8;
    bVar17 = (uVar214 != 0) * (uVar214 < 0x100) * cVar34 - (0xff < uVar214);
    cVar36 = (uVar218 != 0) * (uVar218 < 0x100) * cVar46 - (0xff < uVar218);
    uVar191 = CONCAT13(cVar36,CONCAT12((uVar216 != 0) * (uVar216 < 0x100) * cVar47 -
                                       (0xff < uVar216),
                                       CONCAT11(bVar17,(uVar200 != 0) * (uVar200 < 0x100) * bVar33 -
                                                       (0xff < uVar200))));
    cVar37 = (uVar222 != 0) * (uVar222 < 0x100) * cVar44 - (0xff < uVar222);
    uVar192 = CONCAT15(cVar37,CONCAT14((uVar220 != 0) * (uVar220 < 0x100) * cVar45 -
                                       (0xff < uVar220),uVar191));
    cVar38 = (uVar226 != 0) * (uVar226 < 0x100) * cVar42 - (0xff < uVar226);
    uVar193 = CONCAT17(cVar38,CONCAT16((uVar224 != 0) * (uVar224 < 0x100) * cVar43 -
                                       (0xff < uVar224),uVar192));
    cVar39 = (uVar151 != 0) * (uVar151 < 0x100) * cVar52 - (0xff < uVar151);
    auVar234._0_10_ =
         CONCAT19(cVar39,CONCAT18((uVar138 != 0) * (uVar138 < 0x100) * bVar41 - (0xff < uVar138),
                                  uVar193));
    auVar234[10] = (uVar152 != 0) * (uVar152 < 0x100) * cVar51 - (0xff < uVar152);
    cVar40 = (uVar153 != 0) * (uVar153 < 0x100) * cVar53 - (0xff < uVar153);
    auVar234[0xb] = cVar40;
    auVar237[0xc] = (uVar154 != 0) * (uVar154 < 0x100) * cVar56 - (0xff < uVar154);
    auVar237._0_12_ = auVar234;
    cVar27 = (uVar155 != 0) * (uVar155 < 0x100) * cVar48 - (0xff < uVar155);
    auVar237[0xd] = cVar27;
    auVar240[0xe] = (uVar156 != 0) * (uVar156 < 0x100) * cVar55 - (0xff < uVar156);
    auVar240._0_14_ = auVar237;
    cVar26 = (uVar157 != 0) * (uVar157 < 0x100) * cVar54 - (0xff < uVar157);
    auVar240[0xf] = cVar26;
    uVar200 = (ushort)bVar49;
    uVar214 = (ushort)((uint)uVar139 >> 0x18);
    uVar216 = (ushort)((uint6)uVar140 >> 0x28);
    uVar218 = (ushort)((ulong)uVar141 >> 0x38);
    uVar220 = (ushort)((unkuint10)auVar143._0_10_ >> 0x48);
    uVar222 = auVar143._10_2_ >> 8;
    uVar224 = auVar146._12_2_ >> 8;
    uVar226 = auVar149._14_2_ >> 8;
    uVar138 = (ushort)bVar57;
    uVar151 = (ushort)((uint)uVar123 >> 0x18);
    uVar152 = (ushort)((uint6)uVar124 >> 0x28);
    uVar153 = (ushort)((ulong)uVar125 >> 0x38);
    uVar154 = (ushort)((unkuint10)auVar128._0_10_ >> 0x48);
    uVar155 = auVar128._10_2_ >> 8;
    uVar156 = auVar131._12_2_ >> 8;
    uVar157 = auVar137._14_2_ >> 8;
    bVar25 = (uVar214 != 0) * (uVar214 < 0x100) * cVar50 - (0xff < uVar214);
    cVar35 = (uVar218 != 0) * (uVar218 < 0x100) * cVar59 - (0xff < uVar218);
    uVar123 = CONCAT13(cVar35,CONCAT12((uVar216 != 0) * (uVar216 < 0x100) * cVar58 -
                                       (0xff < uVar216),
                                       CONCAT11(bVar25,(uVar200 != 0) * (uVar200 < 0x100) * bVar49 -
                                                       (0xff < uVar200))));
    cVar8 = (uVar222 != 0) * (uVar222 < 0x100) * cVar8 - (0xff < uVar222);
    uVar124 = CONCAT15(cVar8,CONCAT14((uVar220 != 0) * (uVar220 < 0x100) * cVar60 - (0xff < uVar220)
                                      ,uVar123));
    cVar4 = (uVar226 != 0) * (uVar226 < 0x100) * cVar4 - (0xff < uVar226);
    uVar125 = CONCAT17(cVar4,CONCAT16((uVar224 != 0) * (uVar224 < 0x100) * cVar3 - (0xff < uVar224),
                                      uVar124));
    cVar3 = (uVar151 != 0) * (uVar151 < 0x100) * cVar5 - (0xff < uVar151);
    auVar144._0_10_ =
         CONCAT19(cVar3,CONCAT18((uVar138 != 0) * (uVar138 < 0x100) * bVar57 - (0xff < uVar138),
                                 uVar125));
    auVar144[10] = (uVar152 != 0) * (uVar152 < 0x100) * cVar6 - (0xff < uVar152);
    cVar5 = (uVar153 != 0) * (uVar153 < 0x100) * cVar7 - (0xff < uVar153);
    auVar144[0xb] = cVar5;
    auVar147[0xc] = (uVar154 != 0) * (uVar154 < 0x100) * cVar2 - (0xff < uVar154);
    auVar147._0_12_ = auVar144;
    cVar6 = (uVar155 != 0) * (uVar155 < 0x100) * cVar15 - (0xff < uVar155);
    auVar147[0xd] = cVar6;
    auVar150[0xe] = (uVar156 != 0) * (uVar156 < 0x100) * cVar16 - (0xff < uVar156);
    auVar150._0_14_ = auVar147;
    cVar7 = (uVar157 != 0) * (uVar157 < 0x100) * cVar14 - (0xff < uVar157);
    auVar150[0xf] = cVar7;
    auVar275 = auVar170 & _DAT_001a4ad0;
    auVar133 = auVar267 & _DAT_001a4ad0;
    sVar75 = auVar275._0_2_;
    sVar77 = auVar275._2_2_;
    sVar80 = auVar275._4_2_;
    sVar84 = auVar275._6_2_;
    sVar87 = auVar275._8_2_;
    sVar90 = auVar275._10_2_;
    sVar93 = auVar275._12_2_;
    sVar96 = auVar275._14_2_;
    sVar99 = auVar133._0_2_;
    sVar102 = auVar133._2_2_;
    sVar105 = auVar133._4_2_;
    sVar108 = auVar133._6_2_;
    sVar111 = auVar133._8_2_;
    sVar114 = auVar133._10_2_;
    sVar117 = auVar133._12_2_;
    sVar120 = auVar133._14_2_;
    auVar132 = auVar183 & _DAT_001a4ad0;
    auVar134 = auVar213 & _DAT_001a4ad0;
    sVar76 = auVar132._0_2_;
    sVar78 = auVar132._2_2_;
    sVar81 = auVar132._4_2_;
    sVar85 = auVar132._6_2_;
    sVar88 = auVar132._8_2_;
    sVar91 = auVar132._10_2_;
    sVar94 = auVar132._12_2_;
    sVar97 = auVar132._14_2_;
    sVar100 = auVar134._0_2_;
    sVar103 = auVar134._2_2_;
    sVar106 = auVar134._4_2_;
    sVar109 = auVar134._6_2_;
    sVar112 = auVar134._8_2_;
    sVar115 = auVar134._10_2_;
    sVar118 = auVar134._12_2_;
    sVar121 = auVar134._14_2_;
    auVar255 = auVar240 & _DAT_001a4ad0;
    auVar167 = auVar150 & _DAT_001a4ad0;
    sVar83 = auVar255._0_2_;
    sVar79 = auVar255._2_2_;
    sVar82 = auVar255._4_2_;
    sVar86 = auVar255._6_2_;
    sVar89 = auVar255._8_2_;
    sVar92 = auVar255._10_2_;
    sVar95 = auVar255._12_2_;
    sVar98 = auVar255._14_2_;
    sVar101 = auVar167._0_2_;
    sVar104 = auVar167._2_2_;
    sVar107 = auVar167._4_2_;
    sVar110 = auVar167._6_2_;
    sVar113 = auVar167._8_2_;
    sVar116 = auVar167._10_2_;
    sVar119 = auVar167._12_2_;
    sVar122 = auVar167._14_2_;
    uVar200 = (ushort)bVar1;
    uVar214 = (ushort)((uint)uVar158 >> 0x18);
    uVar216 = (ushort)((uint6)uVar159 >> 0x28);
    uVar218 = (ushort)((ulong)uVar160 >> 0x38);
    uVar220 = (ushort)((unkuint10)auVar163._0_10_ >> 0x48);
    uVar222 = auVar163._10_2_ >> 8;
    uVar224 = auVar166._12_2_ >> 8;
    uVar226 = auVar170._14_2_ >> 8;
    uVar258 = (ushort)bVar9;
    uVar268 = (ushort)((uint)uVar259 >> 0x18);
    uVar269 = (ushort)((uint6)uVar260 >> 0x28);
    uVar270 = (ushort)((ulong)uVar261 >> 0x38);
    uVar271 = (ushort)((unkuint10)auVar263._0_10_ >> 0x48);
    uVar272 = auVar263._10_2_ >> 8;
    uVar273 = auVar265._12_2_ >> 8;
    uVar274 = auVar267._14_2_ >> 8;
    uVar171 = (ushort)bVar65;
    uVar184 = (ushort)((uint)uVar172 >> 0x18);
    uVar185 = (ushort)((uint6)uVar173 >> 0x28);
    uVar186 = (ushort)((ulong)uVar174 >> 0x38);
    uVar187 = (ushort)((unkuint10)auVar177._0_10_ >> 0x48);
    uVar188 = auVar177._10_2_ >> 8;
    uVar189 = auVar180._12_2_ >> 8;
    uVar190 = auVar183._14_2_ >> 8;
    uVar201 = (ushort)bVar73;
    uVar215 = (ushort)((uint)uVar202 >> 0x18);
    uVar217 = (ushort)((uint6)uVar203 >> 0x28);
    uVar219 = (ushort)((ulong)uVar204 >> 0x38);
    uVar221 = (ushort)((unkuint10)auVar207._0_10_ >> 0x48);
    uVar223 = auVar207._10_2_ >> 8;
    uVar225 = auVar210._12_2_ >> 8;
    uVar227 = auVar213._14_2_ >> 8;
    uVar228 = (ushort)bVar17;
    uVar241 = (ushort)((uint)uVar191 >> 0x18);
    uVar242 = (ushort)((uint6)uVar192 >> 0x28);
    uVar243 = (ushort)((ulong)uVar193 >> 0x38);
    uVar244 = (ushort)((unkuint10)auVar234._0_10_ >> 0x48);
    uVar245 = auVar234._10_2_ >> 8;
    uVar246 = auVar237._12_2_ >> 8;
    uVar247 = auVar240._14_2_ >> 8;
    uVar138 = (ushort)bVar25;
    uVar151 = (ushort)((uint)uVar123 >> 0x18);
    uVar152 = (ushort)((uint6)uVar124 >> 0x28);
    uVar153 = (ushort)((ulong)uVar125 >> 0x38);
    uVar154 = (ushort)((unkuint10)auVar144._0_10_ >> 0x48);
    uVar155 = auVar144._10_2_ >> 8;
    uVar156 = auVar147._12_2_ >> 8;
    uVar157 = auVar150._14_2_ >> 8;
    *dst = (0 < sVar75) * (sVar75 < 0x100) * auVar275[0] - (0xff < sVar75);
    dst[1] = (0 < sVar77) * (sVar77 < 0x100) * auVar275[2] - (0xff < sVar77);
    dst[2] = (0 < sVar80) * (sVar80 < 0x100) * auVar275[4] - (0xff < sVar80);
    dst[3] = (0 < sVar84) * (sVar84 < 0x100) * auVar275[6] - (0xff < sVar84);
    dst[4] = (0 < sVar87) * (sVar87 < 0x100) * auVar275[8] - (0xff < sVar87);
    dst[5] = (0 < sVar90) * (sVar90 < 0x100) * auVar275[10] - (0xff < sVar90);
    dst[6] = (0 < sVar93) * (sVar93 < 0x100) * auVar275[0xc] - (0xff < sVar93);
    dst[7] = (0 < sVar96) * (sVar96 < 0x100) * auVar275[0xe] - (0xff < sVar96);
    dst[8] = (0 < sVar99) * (sVar99 < 0x100) * auVar133[0] - (0xff < sVar99);
    dst[9] = (0 < sVar102) * (sVar102 < 0x100) * auVar133[2] - (0xff < sVar102);
    dst[10] = (0 < sVar105) * (sVar105 < 0x100) * auVar133[4] - (0xff < sVar105);
    dst[0xb] = (0 < sVar108) * (sVar108 < 0x100) * auVar133[6] - (0xff < sVar108);
    dst[0xc] = (0 < sVar111) * (sVar111 < 0x100) * auVar133[8] - (0xff < sVar111);
    dst[0xd] = (0 < sVar114) * (sVar114 < 0x100) * auVar133[10] - (0xff < sVar114);
    dst[0xe] = (0 < sVar117) * (sVar117 < 0x100) * auVar133[0xc] - (0xff < sVar117);
    dst[0xf] = (0 < sVar120) * (sVar120 < 0x100) * auVar133[0xe] - (0xff < sVar120);
    dst[0x10] = (0 < sVar76) * (sVar76 < 0x100) * auVar132[0] - (0xff < sVar76);
    dst[0x11] = (0 < sVar78) * (sVar78 < 0x100) * auVar132[2] - (0xff < sVar78);
    dst[0x12] = (0 < sVar81) * (sVar81 < 0x100) * auVar132[4] - (0xff < sVar81);
    dst[0x13] = (0 < sVar85) * (sVar85 < 0x100) * auVar132[6] - (0xff < sVar85);
    dst[0x14] = (0 < sVar88) * (sVar88 < 0x100) * auVar132[8] - (0xff < sVar88);
    dst[0x15] = (0 < sVar91) * (sVar91 < 0x100) * auVar132[10] - (0xff < sVar91);
    dst[0x16] = (0 < sVar94) * (sVar94 < 0x100) * auVar132[0xc] - (0xff < sVar94);
    dst[0x17] = (0 < sVar97) * (sVar97 < 0x100) * auVar132[0xe] - (0xff < sVar97);
    dst[0x18] = (0 < sVar100) * (sVar100 < 0x100) * auVar134[0] - (0xff < sVar100);
    dst[0x19] = (0 < sVar103) * (sVar103 < 0x100) * auVar134[2] - (0xff < sVar103);
    dst[0x1a] = (0 < sVar106) * (sVar106 < 0x100) * auVar134[4] - (0xff < sVar106);
    dst[0x1b] = (0 < sVar109) * (sVar109 < 0x100) * auVar134[6] - (0xff < sVar109);
    dst[0x1c] = (0 < sVar112) * (sVar112 < 0x100) * auVar134[8] - (0xff < sVar112);
    dst[0x1d] = (0 < sVar115) * (sVar115 < 0x100) * auVar134[10] - (0xff < sVar115);
    dst[0x1e] = (0 < sVar118) * (sVar118 < 0x100) * auVar134[0xc] - (0xff < sVar118);
    dst[0x1f] = (0 < sVar121) * (sVar121 < 0x100) * auVar134[0xe] - (0xff < sVar121);
    dst[0x20] = (0 < sVar83) * (sVar83 < 0x100) * auVar255[0] - (0xff < sVar83);
    dst[0x21] = (0 < sVar79) * (sVar79 < 0x100) * auVar255[2] - (0xff < sVar79);
    dst[0x22] = (0 < sVar82) * (sVar82 < 0x100) * auVar255[4] - (0xff < sVar82);
    dst[0x23] = (0 < sVar86) * (sVar86 < 0x100) * auVar255[6] - (0xff < sVar86);
    dst[0x24] = (0 < sVar89) * (sVar89 < 0x100) * auVar255[8] - (0xff < sVar89);
    dst[0x25] = (0 < sVar92) * (sVar92 < 0x100) * auVar255[10] - (0xff < sVar92);
    dst[0x26] = (0 < sVar95) * (sVar95 < 0x100) * auVar255[0xc] - (0xff < sVar95);
    dst[0x27] = (0 < sVar98) * (sVar98 < 0x100) * auVar255[0xe] - (0xff < sVar98);
    dst[0x28] = (0 < sVar101) * (sVar101 < 0x100) * auVar167[0] - (0xff < sVar101);
    dst[0x29] = (0 < sVar104) * (sVar104 < 0x100) * auVar167[2] - (0xff < sVar104);
    dst[0x2a] = (0 < sVar107) * (sVar107 < 0x100) * auVar167[4] - (0xff < sVar107);
    dst[0x2b] = (0 < sVar110) * (sVar110 < 0x100) * auVar167[6] - (0xff < sVar110);
    dst[0x2c] = (0 < sVar113) * (sVar113 < 0x100) * auVar167[8] - (0xff < sVar113);
    dst[0x2d] = (0 < sVar116) * (sVar116 < 0x100) * auVar167[10] - (0xff < sVar116);
    dst[0x2e] = (0 < sVar119) * (sVar119 < 0x100) * auVar167[0xc] - (0xff < sVar119);
    dst[0x2f] = (0 < sVar122) * (sVar122 < 0x100) * auVar167[0xe] - (0xff < sVar122);
    dst[0x30] = (uVar200 != 0) * (uVar200 < 0x100) * bVar1 - (0xff < uVar200);
    dst[0x31] = (uVar214 != 0) * (uVar214 < 0x100) * cVar19 - (0xff < uVar214);
    dst[0x32] = (uVar216 != 0) * (uVar216 < 0x100) * cVar18 - (0xff < uVar216);
    dst[0x33] = (uVar218 != 0) * (uVar218 < 0x100) * cVar10 - (0xff < uVar218);
    dst[0x34] = (uVar220 != 0) * (uVar220 < 0x100) * cVar20 - (0xff < uVar220);
    dst[0x35] = (uVar222 != 0) * (uVar222 < 0x100) * cVar13 - (0xff < uVar222);
    dst[0x36] = (uVar224 != 0) * (uVar224 < 0x100) * cVar12 - (0xff < uVar224);
    dst[0x37] = (uVar226 != 0) * (uVar226 < 0x100) * cVar11 - (0xff < uVar226);
    dst[0x38] = (uVar258 != 0) * (uVar258 < 0x100) * bVar9 - (0xff < uVar258);
    dst[0x39] = (uVar268 != 0) * (uVar268 < 0x100) * cVar21 - (0xff < uVar268);
    dst[0x3a] = (uVar269 != 0) * (uVar269 < 0x100) * cVar22 - (0xff < uVar269);
    dst[0x3b] = (uVar270 != 0) * (uVar270 < 0x100) * cVar23 - (0xff < uVar270);
    dst[0x3c] = (uVar271 != 0) * (uVar271 < 0x100) * cVar61 - (0xff < uVar271);
    dst[0x3d] = (uVar272 != 0) * (uVar272 < 0x100) * cVar62 - (0xff < uVar272);
    dst[0x3e] = (uVar273 != 0) * (uVar273 < 0x100) * cVar63 - (0xff < uVar273);
    dst[0x3f] = (uVar274 != 0) * (uVar274 < 0x100) * cVar64 - (0xff < uVar274);
    dst[0x40] = (uVar171 != 0) * (uVar171 < 0x100) * bVar65 - (0xff < uVar171);
    dst[0x41] = (uVar184 != 0) * (uVar184 < 0x100) * cVar66 - (0xff < uVar184);
    dst[0x42] = (uVar185 != 0) * (uVar185 < 0x100) * cVar67 - (0xff < uVar185);
    dst[0x43] = (uVar186 != 0) * (uVar186 < 0x100) * cVar68 - (0xff < uVar186);
    dst[0x44] = (uVar187 != 0) * (uVar187 < 0x100) * cVar69 - (0xff < uVar187);
    dst[0x45] = (uVar188 != 0) * (uVar188 < 0x100) * cVar70 - (0xff < uVar188);
    dst[0x46] = (uVar189 != 0) * (uVar189 < 0x100) * cVar71 - (0xff < uVar189);
    dst[0x47] = (uVar190 != 0) * (uVar190 < 0x100) * cVar72 - (0xff < uVar190);
    dst[0x48] = (uVar201 != 0) * (uVar201 < 0x100) * bVar73 - (0xff < uVar201);
    dst[0x49] = (uVar215 != 0) * (uVar215 < 0x100) * cVar74 - (0xff < uVar215);
    dst[0x4a] = (uVar217 != 0) * (uVar217 < 0x100) * cVar30 - (0xff < uVar217);
    dst[0x4b] = (uVar219 != 0) * (uVar219 < 0x100) * cVar32 - (0xff < uVar219);
    dst[0x4c] = (uVar221 != 0) * (uVar221 < 0x100) * cVar29 - (0xff < uVar221);
    dst[0x4d] = (uVar223 != 0) * (uVar223 < 0x100) * cVar31 - (0xff < uVar223);
    dst[0x4e] = (uVar225 != 0) * (uVar225 < 0x100) * cVar28 - (0xff < uVar225);
    dst[0x4f] = (uVar227 != 0) * (uVar227 < 0x100) * cVar24 - (0xff < uVar227);
    dst[0x50] = (uVar228 != 0) * (uVar228 < 0x100) * bVar17 - (0xff < uVar228);
    dst[0x51] = (uVar241 != 0) * (uVar241 < 0x100) * cVar36 - (0xff < uVar241);
    dst[0x52] = (uVar242 != 0) * (uVar242 < 0x100) * cVar37 - (0xff < uVar242);
    dst[0x53] = (uVar243 != 0) * (uVar243 < 0x100) * cVar38 - (0xff < uVar243);
    dst[0x54] = (uVar244 != 0) * (uVar244 < 0x100) * cVar39 - (0xff < uVar244);
    dst[0x55] = (uVar245 != 0) * (uVar245 < 0x100) * cVar40 - (0xff < uVar245);
    dst[0x56] = (uVar246 != 0) * (uVar246 < 0x100) * cVar27 - (0xff < uVar246);
    dst[0x57] = (uVar247 != 0) * (uVar247 < 0x100) * cVar26 - (0xff < uVar247);
    dst[0x58] = (uVar138 != 0) * (uVar138 < 0x100) * bVar25 - (0xff < uVar138);
    dst[0x59] = (uVar151 != 0) * (uVar151 < 0x100) * cVar35 - (0xff < uVar151);
    dst[0x5a] = (uVar152 != 0) * (uVar152 < 0x100) * cVar8 - (0xff < uVar152);
    dst[0x5b] = (uVar153 != 0) * (uVar153 < 0x100) * cVar4 - (0xff < uVar153);
    dst[0x5c] = (uVar154 != 0) * (uVar154 < 0x100) * cVar3 - (0xff < uVar154);
    dst[0x5d] = (uVar155 != 0) * (uVar155 < 0x100) * cVar5 - (0xff < uVar155);
    dst[0x5e] = (uVar156 != 0) * (uVar156 < 0x100) * cVar6 - (0xff < uVar156);
    dst[0x5f] = (uVar157 != 0) * (uVar157 < 0x100) * cVar7 - (0xff < uVar157);
    src = src + 0x20;
    dst = dst + 0x60;
  }
  if (0 < num_pixels) {
    VP8LConvertBGRAToRGB_C(src,num_pixels,dst);
    return;
  }
  return;
}

Assistant:

static void ConvertBGRAToRGB_SSE2(const uint32_t* WEBP_RESTRICT src,
                                  int num_pixels, uint8_t* WEBP_RESTRICT dst) {
  const __m128i* in = (const __m128i*)src;
  __m128i* out = (__m128i*)dst;

  while (num_pixels >= 32) {
    // Load the BGRA buffers.
    __m128i in0 = _mm_loadu_si128(in + 0);
    __m128i in1 = _mm_loadu_si128(in + 1);
    __m128i in2 = _mm_loadu_si128(in + 2);
    __m128i in3 = _mm_loadu_si128(in + 3);
    __m128i in4 = _mm_loadu_si128(in + 4);
    __m128i in5 = _mm_loadu_si128(in + 5);
    __m128i in6 = _mm_loadu_si128(in + 6);
    __m128i in7 = _mm_loadu_si128(in + 7);
    VP8L32bToPlanar_SSE2(&in0, &in1, &in2, &in3);
    VP8L32bToPlanar_SSE2(&in4, &in5, &in6, &in7);
    // At this points, in1/in5 contains red only, in2/in6 green only ...
    // Pack the colors in 24b RGB.
    VP8PlanarTo24b_SSE2(&in1, &in5, &in2, &in6, &in3, &in7);
    _mm_storeu_si128(out + 0, in1);
    _mm_storeu_si128(out + 1, in5);
    _mm_storeu_si128(out + 2, in2);
    _mm_storeu_si128(out + 3, in6);
    _mm_storeu_si128(out + 4, in3);
    _mm_storeu_si128(out + 5, in7);
    in += 8;
    out += 6;
    num_pixels -= 32;
  }
  // left-overs
  if (num_pixels > 0) {
    VP8LConvertBGRAToRGB_C((const uint32_t*)in, num_pixels, (uint8_t*)out);
  }
}